

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  float *pfVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [28];
  byte bVar77;
  bool bVar78;
  uint uVar79;
  ulong uVar80;
  long lVar81;
  ulong uVar82;
  uint uVar83;
  long lVar84;
  ulong uVar85;
  Geometry *geometry;
  undefined8 uVar86;
  float fVar104;
  vint4 bi_2;
  undefined1 auVar87 [16];
  float fVar102;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar103;
  float fVar105;
  float fVar106;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar92 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined4 uVar110;
  vint4 bi_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar138 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar139 [32];
  undefined1 auVar133 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  float fVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  vint4 ai_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  vint4 ai;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  vint4 bi;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  undefined4 uVar170;
  vint4 ai_1;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar204;
  float fVar205;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar203 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_860 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_760 [16];
  ulong local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 (*local_678) [16];
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  ulong local_5f0;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5e0 [8];
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  LinearSpace3fa *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined1 local_1d0 [16];
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar82 = (ulong)(byte)PVar6;
  fVar127 = *(float *)(prim + uVar82 * 0x19 + 0x12);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar11 = vsubps_avx(auVar11,*(undefined1 (*) [16])(prim + uVar82 * 0x19 + 6));
  auVar87._0_4_ = fVar127 * auVar11._0_4_;
  auVar87._4_4_ = fVar127 * auVar11._4_4_;
  auVar87._8_4_ = fVar127 * auVar11._8_4_;
  auVar87._12_4_ = fVar127 * auVar11._12_4_;
  auVar155._0_4_ = fVar127 * auVar12._0_4_;
  auVar155._4_4_ = fVar127 * auVar12._4_4_;
  auVar155._8_4_ = fVar127 * auVar12._8_4_;
  auVar155._12_4_ = fVar127 * auVar12._12_4_;
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 4 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar82 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar80 = (ulong)(uint)((int)(uVar82 * 9) * 2);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar82 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  uVar80 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar200._4_4_ = auVar155._0_4_;
  auVar200._0_4_ = auVar155._0_4_;
  auVar200._8_4_ = auVar155._0_4_;
  auVar200._12_4_ = auVar155._0_4_;
  auVar112 = vshufps_avx(auVar155,auVar155,0x55);
  auVar88 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar127 = auVar88._0_4_;
  auVar187._0_4_ = fVar127 * auVar13._0_4_;
  fVar102 = auVar88._4_4_;
  auVar187._4_4_ = fVar102 * auVar13._4_4_;
  fVar104 = auVar88._8_4_;
  auVar187._8_4_ = fVar104 * auVar13._8_4_;
  fVar103 = auVar88._12_4_;
  auVar187._12_4_ = fVar103 * auVar13._12_4_;
  auVar185._0_4_ = auVar16._0_4_ * fVar127;
  auVar185._4_4_ = auVar16._4_4_ * fVar102;
  auVar185._8_4_ = auVar16._8_4_ * fVar104;
  auVar185._12_4_ = auVar16._12_4_ * fVar103;
  auVar171._0_4_ = auVar128._0_4_ * fVar127;
  auVar171._4_4_ = auVar128._4_4_ * fVar102;
  auVar171._8_4_ = auVar128._8_4_ * fVar104;
  auVar171._12_4_ = auVar128._12_4_ * fVar103;
  auVar88 = vfmadd231ps_fma(auVar187,auVar112,auVar12);
  auVar113 = vfmadd231ps_fma(auVar185,auVar112,auVar15);
  auVar112 = vfmadd231ps_fma(auVar171,auVar89,auVar112);
  auVar144 = vfmadd231ps_fma(auVar88,auVar200,auVar11);
  auVar113 = vfmadd231ps_fma(auVar113,auVar200,auVar14);
  auVar151 = vfmadd231ps_fma(auVar112,auVar90,auVar200);
  auVar201._4_4_ = auVar87._0_4_;
  auVar201._0_4_ = auVar87._0_4_;
  auVar201._8_4_ = auVar87._0_4_;
  auVar201._12_4_ = auVar87._0_4_;
  auVar112 = vshufps_avx(auVar87,auVar87,0x55);
  auVar88 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar127 = auVar88._0_4_;
  auVar156._0_4_ = fVar127 * auVar13._0_4_;
  fVar102 = auVar88._4_4_;
  auVar156._4_4_ = fVar102 * auVar13._4_4_;
  fVar104 = auVar88._8_4_;
  auVar156._8_4_ = fVar104 * auVar13._8_4_;
  fVar103 = auVar88._12_4_;
  auVar156._12_4_ = fVar103 * auVar13._12_4_;
  auVar111._0_4_ = auVar16._0_4_ * fVar127;
  auVar111._4_4_ = auVar16._4_4_ * fVar102;
  auVar111._8_4_ = auVar16._8_4_ * fVar104;
  auVar111._12_4_ = auVar16._12_4_ * fVar103;
  auVar88._0_4_ = auVar128._0_4_ * fVar127;
  auVar88._4_4_ = auVar128._4_4_ * fVar102;
  auVar88._8_4_ = auVar128._8_4_ * fVar104;
  auVar88._12_4_ = auVar128._12_4_ * fVar103;
  auVar12 = vfmadd231ps_fma(auVar156,auVar112,auVar12);
  auVar13 = vfmadd231ps_fma(auVar111,auVar112,auVar15);
  auVar15 = vfmadd231ps_fma(auVar88,auVar112,auVar89);
  auVar16 = vfmadd231ps_fma(auVar12,auVar201,auVar11);
  auVar89 = vfmadd231ps_fma(auVar13,auVar201,auVar14);
  auVar128 = vfmadd231ps_fma(auVar15,auVar201,auVar90);
  local_2b0._8_4_ = 0x7fffffff;
  local_2b0._0_8_ = 0x7fffffff7fffffff;
  local_2b0._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx(auVar144,local_2b0);
  auVar150._8_4_ = 0x219392ef;
  auVar150._0_8_ = 0x219392ef219392ef;
  auVar150._12_4_ = 0x219392ef;
  auVar11 = vcmpps_avx(auVar11,auVar150,1);
  auVar12 = vblendvps_avx(auVar144,auVar150,auVar11);
  auVar11 = vandps_avx(auVar113,local_2b0);
  auVar11 = vcmpps_avx(auVar11,auVar150,1);
  auVar13 = vblendvps_avx(auVar113,auVar150,auVar11);
  auVar11 = vandps_avx(auVar151,local_2b0);
  auVar11 = vcmpps_avx(auVar11,auVar150,1);
  auVar11 = vblendvps_avx(auVar151,auVar150,auVar11);
  auVar14 = vrcpps_avx(auVar12);
  auVar165._8_4_ = 0x3f800000;
  auVar165._0_8_ = 0x3f8000003f800000;
  auVar165._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar14,auVar165);
  auVar14 = vfmadd132ps_fma(auVar12,auVar14,auVar14);
  auVar12 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar12,auVar165);
  auVar15 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar11);
  auVar11 = vfnmadd213ps_fma(auVar11,auVar12,auVar165);
  auVar90 = vfmadd132ps_fma(auVar11,auVar12,auVar12);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar82 * 7 + 6);
  auVar11 = vpmovsxwd_avx(auVar11);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar16);
  auVar151._0_4_ = auVar14._0_4_ * auVar11._0_4_;
  auVar151._4_4_ = auVar14._4_4_ * auVar11._4_4_;
  auVar151._8_4_ = auVar14._8_4_ * auVar11._8_4_;
  auVar151._12_4_ = auVar14._12_4_ * auVar11._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar82 * 9 + 6);
  auVar11 = vpmovsxwd_avx(auVar12);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar16);
  auVar157._0_4_ = auVar14._0_4_ * auVar11._0_4_;
  auVar157._4_4_ = auVar14._4_4_ * auVar11._4_4_;
  auVar157._8_4_ = auVar14._8_4_ * auVar11._8_4_;
  auVar157._12_4_ = auVar14._12_4_ * auVar11._12_4_;
  auVar113._1_3_ = 0;
  auVar113[0] = PVar6;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar82 * -2 + 6);
  auVar11 = vpmovsxwd_avx(auVar14);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar89);
  auVar172._0_4_ = auVar11._0_4_ * auVar15._0_4_;
  auVar172._4_4_ = auVar11._4_4_ * auVar15._4_4_;
  auVar172._8_4_ = auVar11._8_4_ * auVar15._8_4_;
  auVar172._12_4_ = auVar11._12_4_ * auVar15._12_4_;
  auVar11 = vcvtdq2ps_avx(auVar12);
  auVar11 = vsubps_avx(auVar11,auVar89);
  auVar112._0_4_ = auVar15._0_4_ * auVar11._0_4_;
  auVar112._4_4_ = auVar15._4_4_ * auVar11._4_4_;
  auVar112._8_4_ = auVar15._8_4_ * auVar11._8_4_;
  auVar112._12_4_ = auVar15._12_4_ * auVar11._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar80 + uVar82 + 6);
  auVar11 = vpmovsxwd_avx(auVar15);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar128);
  auVar144._0_4_ = auVar90._0_4_ * auVar11._0_4_;
  auVar144._4_4_ = auVar90._4_4_ * auVar11._4_4_;
  auVar144._8_4_ = auVar90._8_4_ * auVar11._8_4_;
  auVar144._12_4_ = auVar90._12_4_ * auVar11._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar82 * 0x17 + 6);
  auVar11 = vpmovsxwd_avx(auVar16);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar128);
  auVar89._0_4_ = auVar90._0_4_ * auVar11._0_4_;
  auVar89._4_4_ = auVar90._4_4_ * auVar11._4_4_;
  auVar89._8_4_ = auVar90._8_4_ * auVar11._8_4_;
  auVar89._12_4_ = auVar90._12_4_ * auVar11._12_4_;
  auVar11 = vpminsd_avx(auVar151,auVar157);
  auVar12 = vpminsd_avx(auVar172,auVar112);
  auVar11 = vmaxps_avx(auVar11,auVar12);
  auVar12 = vpminsd_avx(auVar144,auVar89);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar176._4_4_ = uVar110;
  auVar176._0_4_ = uVar110;
  auVar176._8_4_ = uVar110;
  auVar176._12_4_ = uVar110;
  auVar12 = vmaxps_avx(auVar12,auVar176);
  auVar11 = vmaxps_avx(auVar11,auVar12);
  local_2c0._0_4_ = auVar11._0_4_ * 0.99999964;
  local_2c0._4_4_ = auVar11._4_4_ * 0.99999964;
  local_2c0._8_4_ = auVar11._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar11._12_4_ * 0.99999964;
  auVar11 = vpmaxsd_avx(auVar151,auVar157);
  auVar12 = vpmaxsd_avx(auVar172,auVar112);
  auVar11 = vminps_avx(auVar11,auVar12);
  auVar12 = vpmaxsd_avx(auVar144,auVar89);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar128._4_4_ = uVar110;
  auVar128._0_4_ = uVar110;
  auVar128._8_4_ = uVar110;
  auVar128._12_4_ = uVar110;
  auVar12 = vminps_avx(auVar12,auVar128);
  auVar11 = vminps_avx(auVar11,auVar12);
  auVar90._0_4_ = auVar11._0_4_ * 1.0000004;
  auVar90._4_4_ = auVar11._4_4_ * 1.0000004;
  auVar90._8_4_ = auVar11._8_4_ * 1.0000004;
  auVar90._12_4_ = auVar11._12_4_ * 1.0000004;
  auVar113[4] = PVar6;
  auVar113._5_3_ = 0;
  auVar113[8] = PVar6;
  auVar113._9_3_ = 0;
  auVar113[0xc] = PVar6;
  auVar113._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar113,_DAT_01f7fcf0);
  auVar11 = vcmpps_avx(local_2c0,auVar90,2);
  auVar11 = vandps_avx(auVar11,auVar12);
  uVar79 = vmovmskps_avx(auVar11);
  if (uVar79 == 0) {
    bVar78 = false;
  }
  else {
    uVar79 = uVar79 & 0xff;
    local_520 = mm_lookupmask_ps._16_8_;
    uStack_518 = mm_lookupmask_ps._24_8_;
    uStack_510 = mm_lookupmask_ps._16_8_;
    uStack_508 = mm_lookupmask_ps._24_8_;
    local_528 = pre->ray_space + k;
    local_678 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    do {
      lVar17 = 0;
      for (uVar80 = (ulong)uVar79; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      local_7c0._4_4_ = *(undefined4 *)(prim + 2);
      local_748 = (ulong)(uint)local_7c0._4_4_;
      uVar7 = *(uint *)(prim + lVar17 * 4 + 6);
      local_5f0 = (ulong)uVar7;
      pGVar9 = (context->scene->geometries).items[local_748].ptr;
      uVar80 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               local_5f0 *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar84 = (long)pGVar9[1].intersectionFilterN * uVar80;
      lVar81 = (long)pGVar9[1].intersectionFilterN * (uVar80 + 1);
      lVar17 = *(long *)&pGVar9[1].time_range.upper;
      local_5d0 = *(undefined1 (*) [16])(lVar17 + lVar84);
      _local_490 = *(undefined1 (*) [16])(lVar17 + lVar81);
      uVar110 = *(undefined4 *)(lVar17 + 0xc + lVar84);
      auVar166._4_4_ = uVar110;
      auVar166._0_4_ = uVar110;
      auVar166._8_4_ = uVar110;
      auVar166._12_4_ = uVar110;
      local_280._16_4_ = uVar110;
      local_280._0_16_ = auVar166;
      local_280._20_4_ = uVar110;
      local_280._24_4_ = uVar110;
      local_280._28_4_ = uVar110;
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar127 = *(float *)(lVar17 + 0xc + lVar81);
      auVar202._4_4_ = fVar127;
      auVar202._0_4_ = fVar127;
      auVar202._8_4_ = fVar127;
      auVar202._12_4_ = fVar127;
      fStack_290 = fVar127;
      _local_2a0 = auVar202;
      fStack_28c = fVar127;
      fStack_288 = fVar127;
      uStack_284 = fVar127;
      lVar17 = (long)iVar8 * 0x44;
      auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar114._8_4_ = 0xbeaaaaab;
      auVar114._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar114._12_4_ = 0xbeaaaaab;
      local_690 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar9[2].intersectionFilterN +
                                    uVar80 * (long)pGVar9[2].pointQueryFunc),local_5d0,auVar114);
      local_6a0 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar9[2].intersectionFilterN +
                                   (long)pGVar9[2].pointQueryFunc * (uVar80 + 1)),_local_490,
                                  auVar114);
      auVar13 = vsubps_avx(local_5d0,auVar11);
      uVar110 = auVar13._0_4_;
      auVar129._4_4_ = uVar110;
      auVar129._0_4_ = uVar110;
      auVar129._8_4_ = uVar110;
      auVar129._12_4_ = uVar110;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      aVar4 = (local_528->vx).field_0;
      aVar5 = (local_528->vy).field_0;
      fVar102 = (local_528->vz).field_0.m128[0];
      fVar104 = *(float *)((long)&(local_528->vz).field_0 + 4);
      fVar103 = *(float *)((long)&(local_528->vz).field_0 + 8);
      fVar105 = *(float *)((long)&(local_528->vz).field_0 + 0xc);
      auVar173._0_4_ = fVar102 * auVar13._0_4_;
      auVar173._4_4_ = fVar104 * auVar13._4_4_;
      auVar173._8_4_ = fVar103 * auVar13._8_4_;
      auVar173._12_4_ = fVar105 * auVar13._12_4_;
      auVar12 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar5,auVar12);
      auVar16 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar4,auVar129);
      auVar14 = vinsertps_avx(auVar16,auVar166,0x30);
      auVar13 = vsubps_avx(local_690,auVar11);
      uVar110 = auVar13._0_4_;
      auVar145._4_4_ = uVar110;
      auVar145._0_4_ = uVar110;
      auVar145._8_4_ = uVar110;
      auVar145._12_4_ = uVar110;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar186._0_4_ = fVar102 * auVar13._0_4_;
      auVar186._4_4_ = fVar104 * auVar13._4_4_;
      auVar186._8_4_ = fVar103 * auVar13._8_4_;
      auVar186._12_4_ = fVar105 * auVar13._12_4_;
      auVar12 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar12);
      auVar90 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar4,auVar145);
      auVar15 = vsubps_avx(local_6a0,auVar11);
      auVar12 = vshufps_avx(auVar15,auVar15,0x55);
      auVar13 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar167._0_4_ = fVar102 * auVar13._0_4_;
      auVar167._4_4_ = fVar104 * auVar13._4_4_;
      auVar167._8_4_ = fVar103 * auVar13._8_4_;
      auVar167._12_4_ = fVar105 * auVar13._12_4_;
      auVar13 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar5,auVar12);
      auVar12 = vblendps_avx(auVar90,local_690,8);
      auVar130._0_4_ = auVar15._0_4_;
      auVar130._4_4_ = auVar130._0_4_;
      auVar130._8_4_ = auVar130._0_4_;
      auVar130._12_4_ = auVar130._0_4_;
      auVar89 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar4,auVar130);
      auVar15 = vsubps_avx(_local_490,auVar11);
      auVar11 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar192._0_4_ = fVar102 * auVar11._0_4_;
      auVar192._4_4_ = fVar104 * auVar11._4_4_;
      auVar192._8_4_ = fVar103 * auVar11._8_4_;
      auVar192._12_4_ = fVar105 * auVar11._12_4_;
      auVar11 = vshufps_avx(auVar15,auVar15,0x55);
      auVar11 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar5,auVar11);
      auVar13 = vblendps_avx(auVar89,local_6a0,8);
      auVar91._0_4_ = auVar15._0_4_;
      auVar91._4_4_ = auVar91._0_4_;
      auVar91._8_4_ = auVar91._0_4_;
      auVar91._12_4_ = auVar91._0_4_;
      auVar128 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar4,auVar91);
      auVar15 = vinsertps_avx(auVar128,auVar202,0x30);
      auVar11 = vandps_avx(auVar14,local_2b0);
      auVar12 = vandps_avx(auVar12,local_2b0);
      auVar14 = vmaxps_avx(auVar11,auVar12);
      auVar11 = vandps_avx(auVar13,local_2b0);
      auVar12 = vandps_avx(auVar15,local_2b0);
      auVar11 = vmaxps_avx(auVar11,auVar12);
      auVar11 = vmaxps_avx(auVar14,auVar11);
      auVar12 = vmovshdup_avx(auVar11);
      auVar12 = vmaxss_avx(auVar12,auVar11);
      auVar11 = vshufpd_avx(auVar11,auVar11,1);
      auVar11 = vmaxss_avx(auVar11,auVar12);
      auVar12 = vmovshdup_avx(auVar16);
      uVar86 = auVar12._0_8_;
      local_4c0._8_8_ = uVar86;
      local_4c0._0_8_ = uVar86;
      local_4c0._16_8_ = uVar86;
      local_4c0._24_8_ = uVar86;
      auVar12 = vmovshdup_avx(auVar90);
      uVar86 = auVar12._0_8_;
      local_6c0._8_8_ = uVar86;
      local_6c0._0_8_ = uVar86;
      local_6c0._16_8_ = uVar86;
      local_6c0._24_8_ = uVar86;
      auVar141 = *(undefined1 (*) [32])(bezier_basis0 + lVar17 + 0x908);
      auVar12 = vmovshdup_avx(auVar89);
      uVar86 = auVar12._0_8_;
      auVar188._8_8_ = uVar86;
      auVar188._0_8_ = uVar86;
      auVar188._16_8_ = uVar86;
      auVar188._24_8_ = uVar86;
      auVar12 = vmovshdup_avx(auVar128);
      uVar110 = auVar89._0_4_;
      auVar117._4_4_ = uVar110;
      auVar117._0_4_ = uVar110;
      auVar117._8_4_ = uVar110;
      auVar117._12_4_ = uVar110;
      auVar117._16_4_ = uVar110;
      auVar117._20_4_ = uVar110;
      auVar117._24_4_ = uVar110;
      auVar117._28_4_ = uVar110;
      pauVar1 = (undefined1 (*) [32])(bezier_basis0 + lVar17 + 0xd8c);
      fVar103 = *(float *)*pauVar1;
      fVar105 = *(float *)(bezier_basis0 + lVar17 + 0xd90);
      fVar106 = *(float *)(bezier_basis0 + lVar17 + 0xd94);
      fVar107 = *(float *)(bezier_basis0 + lVar17 + 0xd98);
      fVar108 = *(float *)(bezier_basis0 + lVar17 + 0xd9c);
      fVar109 = *(float *)(bezier_basis0 + lVar17 + 0xda0);
      fVar67 = *(float *)(bezier_basis0 + lVar17 + 0xda4);
      auVar76 = *(undefined1 (*) [28])*pauVar1;
      local_6e0 = auVar128._0_4_;
      auVar146._0_4_ = fVar103 * local_6e0;
      auVar146._4_4_ = fVar105 * local_6e0;
      auVar146._8_4_ = fVar106 * local_6e0;
      auVar146._12_4_ = fVar107 * local_6e0;
      auVar146._16_4_ = fVar108 * local_6e0;
      auVar146._20_4_ = fVar109 * local_6e0;
      auVar146._24_4_ = fVar67 * local_6e0;
      auVar146._28_4_ = 0;
      auVar13 = vfmadd231ps_fma(auVar146,auVar141,auVar117);
      fVar102 = auVar12._0_4_;
      auVar137._0_4_ = fVar103 * fVar102;
      fVar104 = auVar12._4_4_;
      auVar137._4_4_ = fVar105 * fVar104;
      auVar137._8_4_ = fVar106 * fVar102;
      auVar137._12_4_ = fVar107 * fVar104;
      auVar137._16_4_ = fVar108 * fVar102;
      auVar137._20_4_ = fVar109 * fVar104;
      auVar137._24_4_ = fVar67 * fVar102;
      auVar137._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar137,auVar141,auVar188);
      auVar137 = *(undefined1 (*) [32])(bezier_basis0 + lVar17 + 0x484);
      uVar170 = auVar90._0_4_;
      local_720._4_4_ = uVar170;
      local_720._0_4_ = uVar170;
      local_720._8_4_ = uVar170;
      local_720._12_4_ = uVar170;
      local_720._16_4_ = uVar170;
      local_720._20_4_ = uVar170;
      local_720._24_4_ = uVar170;
      local_720._28_4_ = uVar170;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar137,local_720);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar137,local_6c0);
      auVar146 = *(undefined1 (*) [32])(bezier_basis0 + lVar17);
      uVar170 = auVar16._0_4_;
      local_700._4_4_ = uVar170;
      local_700._0_4_ = uVar170;
      local_700._8_4_ = uVar170;
      local_700._12_4_ = uVar170;
      local_700._16_4_ = uVar170;
      local_700._20_4_ = uVar170;
      local_700._24_4_ = uVar170;
      local_700._28_4_ = uVar170;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar146,local_700);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar146,local_4c0);
      local_340 = *(undefined1 (*) [32])(bezier_basis1 + lVar17 + 0x908);
      fVar68 = *(float *)(bezier_basis1 + lVar17 + 0xd8c);
      fVar69 = *(float *)(bezier_basis1 + lVar17 + 0xd90);
      fVar70 = *(float *)(bezier_basis1 + lVar17 + 0xd94);
      fVar71 = *(float *)(bezier_basis1 + lVar17 + 0xd98);
      fVar72 = *(float *)(bezier_basis1 + lVar17 + 0xd9c);
      fVar73 = *(float *)(bezier_basis1 + lVar17 + 0xda0);
      fVar74 = *(float *)(bezier_basis1 + lVar17 + 0xda4);
      auVar101._4_4_ = fVar69 * local_6e0;
      auVar101._0_4_ = fVar68 * local_6e0;
      auVar101._8_4_ = fVar70 * local_6e0;
      auVar101._12_4_ = fVar71 * local_6e0;
      auVar101._16_4_ = fVar72 * local_6e0;
      auVar101._20_4_ = fVar73 * local_6e0;
      auVar101._24_4_ = fVar74 * local_6e0;
      auVar101._28_4_ = local_6e0;
      auVar14 = vfmadd231ps_fma(auVar101,local_340,auVar117);
      auVar123._4_4_ = fVar69 * fVar104;
      auVar123._0_4_ = fVar68 * fVar102;
      auVar123._8_4_ = fVar70 * fVar102;
      auVar123._12_4_ = fVar71 * fVar104;
      auVar123._16_4_ = fVar72 * fVar102;
      auVar123._20_4_ = fVar73 * fVar104;
      auVar123._24_4_ = fVar74 * fVar102;
      auVar123._28_4_ = uVar110;
      auVar15 = vfmadd231ps_fma(auVar123,local_340,auVar188);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar17 + 0x484);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar101,local_720);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar101,local_6c0);
      auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar17);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar123,local_700);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar123,local_4c0);
      auVar93 = ZEXT1632(auVar14);
      _local_2e0 = ZEXT1632(auVar13);
      auVar100 = vsubps_avx(auVar93,_local_2e0);
      auVar118 = ZEXT1632(auVar15);
      local_300 = ZEXT1632(auVar12);
      local_480 = vsubps_avx(auVar118,local_300);
      auVar94._0_4_ = auVar12._0_4_ * auVar100._0_4_;
      auVar94._4_4_ = auVar12._4_4_ * auVar100._4_4_;
      auVar94._8_4_ = auVar12._8_4_ * auVar100._8_4_;
      auVar94._12_4_ = auVar12._12_4_ * auVar100._12_4_;
      auVar94._16_4_ = auVar100._16_4_ * 0.0;
      auVar94._20_4_ = auVar100._20_4_ * 0.0;
      auVar94._24_4_ = auVar100._24_4_ * 0.0;
      auVar94._28_4_ = 0;
      fVar199 = local_480._0_4_;
      auVar119._0_4_ = fVar199 * auVar13._0_4_;
      fVar204 = local_480._4_4_;
      auVar119._4_4_ = fVar204 * auVar13._4_4_;
      fVar205 = local_480._8_4_;
      auVar119._8_4_ = fVar205 * auVar13._8_4_;
      fVar206 = local_480._12_4_;
      auVar119._12_4_ = fVar206 * auVar13._12_4_;
      fVar207 = local_480._16_4_;
      auVar119._16_4_ = fVar207 * 0.0;
      fVar208 = local_480._20_4_;
      auVar119._20_4_ = fVar208 * 0.0;
      fVar209 = local_480._24_4_;
      auVar119._24_4_ = fVar209 * 0.0;
      auVar119._28_4_ = 0;
      auVar94 = vsubps_avx(auVar94,auVar119);
      auVar12 = vpermilps_avx(local_690,0xff);
      uVar86 = auVar12._0_8_;
      local_80._8_8_ = uVar86;
      local_80._0_8_ = uVar86;
      local_80._16_8_ = uVar86;
      local_80._24_8_ = uVar86;
      auVar13 = vpermilps_avx(local_6a0,0xff);
      local_a0._0_8_ = auVar13._0_8_;
      local_a0._8_8_ = local_a0._0_8_;
      local_a0._16_8_ = local_a0._0_8_;
      local_a0._24_8_ = local_a0._0_8_;
      auVar183._4_4_ = fVar105 * fVar127;
      auVar183._0_4_ = fVar103 * fVar127;
      auVar183._8_4_ = fVar106 * fVar127;
      auVar183._12_4_ = fVar107 * fVar127;
      auVar183._16_4_ = fVar108 * fVar127;
      auVar183._20_4_ = fVar109 * fVar127;
      auVar183._24_4_ = fVar67 * fVar127;
      auVar183._28_4_ = *(undefined4 *)(bezier_basis0 + lVar17 + 0xda8);
      auVar13 = vfmadd231ps_fma(auVar183,local_a0,auVar141);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar137,local_80);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar146,local_280);
      auVar178._4_4_ = fVar69 * fVar127;
      auVar178._0_4_ = fVar68 * fVar127;
      auVar178._8_4_ = fVar70 * fVar127;
      auVar178._12_4_ = fVar71 * fVar127;
      auVar178._16_4_ = fVar72 * fVar127;
      auVar178._20_4_ = fVar73 * fVar127;
      auVar178._24_4_ = fVar74 * fVar127;
      auVar178._28_4_ = auVar146._28_4_;
      auVar14 = vfmadd231ps_fma(auVar178,local_340,local_a0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar101,local_80);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar123,local_280);
      auVar168._4_4_ = fVar204 * fVar204;
      auVar168._0_4_ = fVar199 * fVar199;
      auVar168._8_4_ = fVar205 * fVar205;
      auVar168._12_4_ = fVar206 * fVar206;
      auVar168._16_4_ = fVar207 * fVar207;
      auVar168._20_4_ = fVar208 * fVar208;
      auVar168._24_4_ = fVar209 * fVar209;
      auVar168._28_4_ = auVar12._4_4_;
      auVar12 = vfmadd231ps_fma(auVar168,auVar100,auVar100);
      auVar183 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
      auVar179._4_4_ = auVar183._4_4_ * auVar183._4_4_ * auVar12._4_4_;
      auVar179._0_4_ = auVar183._0_4_ * auVar183._0_4_ * auVar12._0_4_;
      auVar179._8_4_ = auVar183._8_4_ * auVar183._8_4_ * auVar12._8_4_;
      auVar179._12_4_ = auVar183._12_4_ * auVar183._12_4_ * auVar12._12_4_;
      auVar179._16_4_ = auVar183._16_4_ * auVar183._16_4_ * 0.0;
      auVar179._20_4_ = auVar183._20_4_ * auVar183._20_4_ * 0.0;
      auVar179._24_4_ = auVar183._24_4_ * auVar183._24_4_ * 0.0;
      auVar179._28_4_ = auVar183._28_4_;
      auVar193._4_4_ = auVar94._4_4_ * auVar94._4_4_;
      auVar193._0_4_ = auVar94._0_4_ * auVar94._0_4_;
      auVar193._8_4_ = auVar94._8_4_ * auVar94._8_4_;
      auVar193._12_4_ = auVar94._12_4_ * auVar94._12_4_;
      auVar193._16_4_ = auVar94._16_4_ * auVar94._16_4_;
      auVar193._20_4_ = auVar94._20_4_ * auVar94._20_4_;
      auVar193._24_4_ = auVar94._24_4_ * auVar94._24_4_;
      auVar193._28_4_ = 0;
      auVar183 = vcmpps_avx(auVar193,auVar179,2);
      auVar143 = ZEXT3264(auVar183);
      fVar127 = auVar11._0_4_ * 4.7683716e-07;
      auVar95._0_4_ = (float)iVar8;
      register0x00001504 = auVar128._4_12_;
      auVar95._4_4_ = auVar95._0_4_;
      auVar95._8_4_ = auVar95._0_4_;
      auVar95._12_4_ = auVar95._0_4_;
      auVar95._16_4_ = auVar95._0_4_;
      auVar95._20_4_ = auVar95._0_4_;
      auVar95._24_4_ = auVar95._0_4_;
      auVar95._28_4_ = auVar95._0_4_;
      auVar178 = vcmpps_avx(_DAT_01faff40,auVar95,1);
      auVar11 = vpermilps_avx(auVar16,0xaa);
      uVar86 = auVar11._0_8_;
      local_5a0._8_8_ = uVar86;
      local_5a0._0_8_ = uVar86;
      local_5a0._16_8_ = uVar86;
      local_5a0._24_8_ = uVar86;
      auVar11 = vpermilps_avx(auVar90,0xaa);
      uVar86 = auVar11._0_8_;
      local_460._8_8_ = uVar86;
      local_460._0_8_ = uVar86;
      local_460._16_8_ = uVar86;
      local_460._24_8_ = uVar86;
      auVar11 = vpermilps_avx(auVar89,0xaa);
      uVar86 = auVar11._0_8_;
      local_c0._8_8_ = uVar86;
      local_c0._0_8_ = uVar86;
      local_c0._16_8_ = uVar86;
      local_c0._24_8_ = uVar86;
      auVar11 = vshufps_avx(auVar128,auVar128,0xaa);
      local_e0 = auVar11._0_8_;
      auVar168 = auVar178 & auVar183;
      uVar83 = *(uint *)(ray + k * 4 + 0x30);
      local_640._0_16_ = ZEXT416(uVar83);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      local_740._0_16_ = ZEXT416((uint)fVar127);
      auVar179 = local_580;
      fStack_6dc = local_6e0;
      fStack_6d8 = local_6e0;
      fStack_6d4 = local_6e0;
      fStack_6d0 = local_6e0;
      fStack_6cc = local_6e0;
      fStack_6c8 = local_6e0;
      fStack_6c4 = local_6e0;
      local_5e0._0_4_ = auVar95._0_4_;
      if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar168 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar168 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar168 >> 0x7f,0) == '\0') &&
            (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar168 >> 0xbf,0) == '\0') &&
          (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar168[0x1f]) {
LAB_015f0538:
        auVar169 = ZEXT3264(CONCAT428(local_6e0,
                                      CONCAT424(local_6e0,
                                                CONCAT420(local_6e0,
                                                          CONCAT416(local_6e0,
                                                                    CONCAT412(local_6e0,
                                                                              CONCAT48(local_6e0,
                                                                                       CONCAT44(
                                                  local_6e0,local_6e0))))))));
LAB_015f054a:
        auVar175 = ZEXT3264(local_720);
        bVar78 = false;
        auVar149 = ZEXT3264(local_700);
        auVar101 = local_560;
      }
      else {
        local_360 = vandps_avx(auVar183,auVar178);
        fVar103 = auVar11._0_4_;
        fVar105 = auVar11._4_4_;
        auVar198._4_4_ = fVar69 * fVar105;
        auVar198._0_4_ = fVar68 * fVar103;
        auVar198._8_4_ = fVar70 * fVar103;
        auVar198._12_4_ = fVar71 * fVar105;
        auVar198._16_4_ = fVar72 * fVar103;
        auVar198._20_4_ = fVar73 * fVar105;
        auVar198._24_4_ = fVar74 * fVar103;
        auVar198._28_4_ = local_360._28_4_;
        auVar11 = vfmadd213ps_fma(local_340,local_c0,auVar198);
        auVar11 = vfmadd213ps_fma(auVar101,local_460,ZEXT1632(auVar11));
        auVar11 = vfmadd213ps_fma(auVar123,local_5a0,ZEXT1632(auVar11));
        local_320._0_4_ = auVar76._0_4_;
        local_320._4_4_ = auVar76._4_4_;
        fStack_318 = auVar76._8_4_;
        fStack_314 = auVar76._12_4_;
        fStack_310 = auVar76._16_4_;
        fStack_30c = auVar76._20_4_;
        fStack_308 = auVar76._24_4_;
        auVar96._0_4_ = fVar103 * (float)local_320._0_4_;
        auVar96._4_4_ = fVar105 * (float)local_320._4_4_;
        auVar96._8_4_ = fVar103 * fStack_318;
        auVar96._12_4_ = fVar105 * fStack_314;
        auVar96._16_4_ = fVar103 * fStack_310;
        auVar96._20_4_ = fVar105 * fStack_30c;
        auVar96._24_4_ = fVar103 * fStack_308;
        auVar96._28_4_ = 0;
        auVar12 = vfmadd213ps_fma(auVar141,local_c0,auVar96);
        auVar12 = vfmadd213ps_fma(auVar137,local_460,ZEXT1632(auVar12));
        auVar141 = *(undefined1 (*) [32])(bezier_basis0 + lVar17 + 0x1210);
        auVar137 = *(undefined1 (*) [32])(bezier_basis0 + lVar17 + 0x1694);
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar17 + 0x1b18);
        fVar106 = *(float *)(bezier_basis0 + lVar17 + 0x1f9c);
        fVar107 = *(float *)(bezier_basis0 + lVar17 + 0x1fa0);
        fVar108 = *(float *)(bezier_basis0 + lVar17 + 0x1fa4);
        fVar109 = *(float *)(bezier_basis0 + lVar17 + 0x1fa8);
        fVar67 = *(float *)(bezier_basis0 + lVar17 + 0x1fac);
        fVar68 = *(float *)(bezier_basis0 + lVar17 + 0x1fb0);
        fVar69 = *(float *)(bezier_basis0 + lVar17 + 0x1fb4);
        auVar18._4_4_ = local_6e0 * fVar107;
        auVar18._0_4_ = local_6e0 * fVar106;
        auVar18._8_4_ = local_6e0 * fVar108;
        auVar18._12_4_ = local_6e0 * fVar109;
        auVar18._16_4_ = local_6e0 * fVar67;
        auVar18._20_4_ = local_6e0 * fVar68;
        auVar18._24_4_ = local_6e0 * fVar69;
        auVar18._28_4_ = auVar94._28_4_;
        auVar177._0_4_ = fVar106 * fVar102;
        auVar177._4_4_ = fVar107 * fVar104;
        auVar177._8_4_ = fVar108 * fVar102;
        auVar177._12_4_ = fVar109 * fVar104;
        auVar177._16_4_ = fVar67 * fVar102;
        auVar177._20_4_ = fVar68 * fVar104;
        auVar177._24_4_ = fVar69 * fVar102;
        auVar177._28_4_ = 0;
        auVar19._4_4_ = fVar107 * fVar105;
        auVar19._0_4_ = fVar106 * fVar103;
        auVar19._8_4_ = fVar108 * fVar103;
        auVar19._12_4_ = fVar109 * fVar105;
        auVar19._16_4_ = fVar67 * fVar103;
        auVar19._20_4_ = fVar68 * fVar105;
        auVar19._24_4_ = fVar69 * fVar103;
        auVar19._28_4_ = *(undefined4 *)(bezier_basis1 + lVar17 + 0xda8);
        auVar16 = vfmadd231ps_fma(auVar18,auVar101,auVar117);
        auVar90 = vfmadd231ps_fma(auVar177,auVar101,auVar188);
        auVar89 = vfmadd231ps_fma(auVar19,local_c0,auVar101);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar137,local_720);
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar137,local_6c0);
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),local_460,auVar137);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar141,local_700);
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar141,local_4c0);
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar141,local_5a0);
        fVar106 = *(float *)(bezier_basis1 + lVar17 + 0x1f9c);
        fVar107 = *(float *)(bezier_basis1 + lVar17 + 0x1fa0);
        fVar108 = *(float *)(bezier_basis1 + lVar17 + 0x1fa4);
        fVar109 = *(float *)(bezier_basis1 + lVar17 + 0x1fa8);
        fVar67 = *(float *)(bezier_basis1 + lVar17 + 0x1fac);
        fVar68 = *(float *)(bezier_basis1 + lVar17 + 0x1fb0);
        fVar69 = *(float *)(bezier_basis1 + lVar17 + 0x1fb4);
        auVar189._0_4_ = local_6e0 * fVar106;
        auVar189._4_4_ = local_6e0 * fVar107;
        auVar189._8_4_ = local_6e0 * fVar108;
        auVar189._12_4_ = local_6e0 * fVar109;
        auVar189._16_4_ = local_6e0 * fVar67;
        auVar189._20_4_ = local_6e0 * fVar68;
        auVar189._24_4_ = local_6e0 * fVar69;
        auVar189._28_4_ = 0;
        auVar20._4_4_ = fVar104 * fVar107;
        auVar20._0_4_ = fVar102 * fVar106;
        auVar20._8_4_ = fVar102 * fVar108;
        auVar20._12_4_ = fVar104 * fVar109;
        auVar20._16_4_ = fVar102 * fVar67;
        auVar20._20_4_ = fVar104 * fVar68;
        auVar20._24_4_ = fVar102 * fVar69;
        auVar20._28_4_ = local_6e0;
        auVar21._4_4_ = fVar105 * fVar107;
        auVar21._0_4_ = fVar103 * fVar106;
        auVar21._8_4_ = fVar103 * fVar108;
        auVar21._12_4_ = fVar105 * fVar109;
        auVar21._16_4_ = fVar103 * fVar67;
        auVar21._20_4_ = fVar105 * fVar68;
        auVar21._24_4_ = fVar103 * fVar69;
        auVar21._28_4_ = *(undefined4 *)(bezier_basis0 + lVar17 + 0x1fb8);
        auVar141 = *(undefined1 (*) [32])(bezier_basis1 + lVar17 + 0x1b18);
        auVar128 = vfmadd231ps_fma(auVar189,auVar141,auVar117);
        auVar112 = vfmadd231ps_fma(auVar20,auVar141,auVar188);
        auVar88 = vfmadd231ps_fma(auVar21,local_c0,auVar141);
        auVar141 = *(undefined1 (*) [32])(bezier_basis1 + lVar17 + 0x1694);
        auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar141,local_720);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar141,local_6c0);
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar141,local_460);
        auVar141 = *(undefined1 (*) [32])(bezier_basis1 + lVar17 + 0x1210);
        auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),auVar141,local_700);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar141,local_4c0);
        auVar120._8_4_ = 0x7fffffff;
        auVar120._0_8_ = 0x7fffffff7fffffff;
        auVar120._12_4_ = 0x7fffffff;
        auVar120._16_4_ = 0x7fffffff;
        auVar120._20_4_ = 0x7fffffff;
        auVar120._24_4_ = 0x7fffffff;
        auVar120._28_4_ = 0x7fffffff;
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),local_5a0,auVar141);
        auVar141 = vandps_avx(ZEXT1632(auVar16),auVar120);
        auVar137 = vandps_avx(ZEXT1632(auVar90),auVar120);
        auVar137 = vmaxps_avx(auVar141,auVar137);
        auVar141 = vandps_avx(ZEXT1632(auVar89),auVar120);
        auVar141 = vmaxps_avx(auVar137,auVar141);
        auVar138._4_4_ = fVar127;
        auVar138._0_4_ = fVar127;
        auVar138._8_4_ = fVar127;
        auVar138._12_4_ = fVar127;
        auVar138._16_4_ = fVar127;
        auVar138._20_4_ = fVar127;
        auVar138._24_4_ = fVar127;
        auVar138._28_4_ = fVar127;
        auVar141 = vcmpps_avx(auVar141,auVar138,1);
        auVar101 = vblendvps_avx(ZEXT1632(auVar16),auVar100,auVar141);
        auVar123 = vblendvps_avx(ZEXT1632(auVar90),local_480,auVar141);
        auVar141 = vandps_avx(ZEXT1632(auVar128),auVar120);
        auVar137 = vandps_avx(ZEXT1632(auVar112),auVar120);
        auVar137 = vmaxps_avx(auVar141,auVar137);
        auVar141 = vandps_avx(ZEXT1632(auVar88),auVar120);
        auVar141 = vmaxps_avx(auVar137,auVar141);
        auVar183 = vcmpps_avx(auVar141,auVar138,1);
        auVar141 = vblendvps_avx(ZEXT1632(auVar128),auVar100,auVar183);
        auVar137 = vblendvps_avx(ZEXT1632(auVar112),local_480,auVar183);
        auVar12 = vfmadd213ps_fma(auVar146,local_5a0,ZEXT1632(auVar12));
        auVar16 = vfmadd213ps_fma(auVar101,auVar101,ZEXT832(0) << 0x20);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar123,auVar123);
        auVar146 = vrsqrtps_avx(ZEXT1632(auVar16));
        fVar127 = auVar146._0_4_;
        fVar103 = auVar146._4_4_;
        fVar105 = auVar146._8_4_;
        fVar106 = auVar146._12_4_;
        fVar107 = auVar146._16_4_;
        fVar108 = auVar146._20_4_;
        fVar109 = auVar146._24_4_;
        auVar100._4_4_ = fVar103 * fVar103 * fVar103 * auVar16._4_4_ * -0.5;
        auVar100._0_4_ = fVar127 * fVar127 * fVar127 * auVar16._0_4_ * -0.5;
        auVar100._8_4_ = fVar105 * fVar105 * fVar105 * auVar16._8_4_ * -0.5;
        auVar100._12_4_ = fVar106 * fVar106 * fVar106 * auVar16._12_4_ * -0.5;
        auVar100._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar100._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar100._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar100._28_4_ = 0;
        auVar190._8_4_ = 0x3fc00000;
        auVar190._0_8_ = 0x3fc000003fc00000;
        auVar190._12_4_ = 0x3fc00000;
        auVar190._16_4_ = 0x3fc00000;
        auVar190._20_4_ = 0x3fc00000;
        auVar190._24_4_ = 0x3fc00000;
        auVar190._28_4_ = 0x3fc00000;
        auVar16 = vfmadd231ps_fma(auVar100,auVar190,auVar146);
        fVar127 = auVar16._0_4_;
        fVar103 = auVar16._4_4_;
        auVar22._4_4_ = auVar123._4_4_ * fVar103;
        auVar22._0_4_ = auVar123._0_4_ * fVar127;
        fVar105 = auVar16._8_4_;
        auVar22._8_4_ = auVar123._8_4_ * fVar105;
        fVar106 = auVar16._12_4_;
        auVar22._12_4_ = auVar123._12_4_ * fVar106;
        auVar22._16_4_ = auVar123._16_4_ * 0.0;
        auVar22._20_4_ = auVar123._20_4_ * 0.0;
        auVar22._24_4_ = auVar123._24_4_ * 0.0;
        auVar22._28_4_ = auVar146._28_4_;
        auVar23._4_4_ = -auVar101._4_4_ * fVar103;
        auVar23._0_4_ = -auVar101._0_4_ * fVar127;
        auVar23._8_4_ = -auVar101._8_4_ * fVar105;
        auVar23._12_4_ = -auVar101._12_4_ * fVar106;
        auVar23._16_4_ = -auVar101._16_4_ * 0.0;
        auVar23._20_4_ = -auVar101._20_4_ * 0.0;
        auVar23._24_4_ = -auVar101._24_4_ * 0.0;
        auVar23._28_4_ = 0x80000000;
        auVar16 = vfmadd213ps_fma(auVar141,auVar141,ZEXT832(0) << 0x20);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar137,auVar137);
        auVar146 = vrsqrtps_avx(ZEXT1632(auVar16));
        auVar24._28_4_ = auVar183._28_4_;
        auVar24._0_28_ =
             ZEXT1628(CONCAT412(fVar106 * 0.0,
                                CONCAT48(fVar105 * 0.0,CONCAT44(fVar103 * 0.0,fVar127 * 0.0))));
        fVar127 = auVar146._0_4_;
        fVar103 = auVar146._4_4_;
        fVar105 = auVar146._8_4_;
        fVar106 = auVar146._12_4_;
        fVar107 = auVar146._16_4_;
        fVar108 = auVar146._20_4_;
        fVar109 = auVar146._24_4_;
        auVar25._4_4_ = fVar103 * fVar103 * fVar103 * auVar16._4_4_ * -0.5;
        auVar25._0_4_ = fVar127 * fVar127 * fVar127 * auVar16._0_4_ * -0.5;
        auVar25._8_4_ = fVar105 * fVar105 * fVar105 * auVar16._8_4_ * -0.5;
        auVar25._12_4_ = fVar106 * fVar106 * fVar106 * auVar16._12_4_ * -0.5;
        auVar25._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar25._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar25._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar25._28_4_ = 0;
        auVar16 = vfmadd231ps_fma(auVar25,auVar190,auVar146);
        fVar127 = auVar16._0_4_;
        fVar103 = auVar16._4_4_;
        auVar26._4_4_ = auVar137._4_4_ * fVar103;
        auVar26._0_4_ = auVar137._0_4_ * fVar127;
        fVar105 = auVar16._8_4_;
        auVar26._8_4_ = auVar137._8_4_ * fVar105;
        fVar106 = auVar16._12_4_;
        auVar26._12_4_ = auVar137._12_4_ * fVar106;
        auVar26._16_4_ = auVar137._16_4_ * 0.0;
        auVar26._20_4_ = auVar137._20_4_ * 0.0;
        auVar26._24_4_ = auVar137._24_4_ * 0.0;
        auVar26._28_4_ = auVar137._28_4_;
        auVar27._4_4_ = fVar103 * -auVar141._4_4_;
        auVar27._0_4_ = fVar127 * -auVar141._0_4_;
        auVar27._8_4_ = fVar105 * -auVar141._8_4_;
        auVar27._12_4_ = fVar106 * -auVar141._12_4_;
        auVar27._16_4_ = -auVar141._16_4_ * 0.0;
        auVar27._20_4_ = -auVar141._20_4_ * 0.0;
        auVar27._24_4_ = -auVar141._24_4_ * 0.0;
        auVar27._28_4_ = auVar101._28_4_ ^ 0x80000000;
        auVar141._28_4_ = auVar146._28_4_;
        auVar141._0_28_ =
             ZEXT1628(CONCAT412(fVar106 * 0.0,
                                CONCAT48(fVar105 * 0.0,CONCAT44(fVar103 * 0.0,fVar127 * 0.0))));
        auVar16 = vfmadd213ps_fma(auVar22,ZEXT1632(auVar13),_local_2e0);
        auVar137 = ZEXT1632(auVar13);
        auVar90 = vfmadd213ps_fma(auVar23,auVar137,local_300);
        auVar89 = vfmadd213ps_fma(auVar24,auVar137,ZEXT1632(auVar12));
        local_500 = ZEXT1632(auVar89);
        auVar112 = vfnmadd213ps_fma(auVar22,auVar137,_local_2e0);
        auVar89 = vfmadd213ps_fma(auVar26,ZEXT1632(auVar14),auVar93);
        auVar88 = vfnmadd213ps_fma(auVar23,auVar137,local_300);
        auVar137 = ZEXT1632(auVar14);
        auVar128 = vfmadd213ps_fma(auVar27,auVar137,auVar118);
        auVar198 = ZEXT1632(auVar13);
        auVar151 = vfnmadd231ps_fma(ZEXT1632(auVar12),auVar198,auVar24);
        auVar12 = vfmadd213ps_fma(auVar141,auVar137,ZEXT1632(auVar11));
        auVar113 = vfnmadd213ps_fma(auVar26,auVar137,auVar93);
        auVar144 = vfnmadd213ps_fma(auVar27,auVar137,auVar118);
        auVar87 = vfnmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar14),auVar141);
        auVar141 = vsubps_avx(ZEXT1632(auVar128),ZEXT1632(auVar88));
        auVar137 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar151));
        auVar93._4_4_ = auVar151._4_4_ * auVar141._4_4_;
        auVar93._0_4_ = auVar151._0_4_ * auVar141._0_4_;
        auVar93._8_4_ = auVar151._8_4_ * auVar141._8_4_;
        auVar93._12_4_ = auVar151._12_4_ * auVar141._12_4_;
        auVar93._16_4_ = auVar141._16_4_ * 0.0;
        auVar93._20_4_ = auVar141._20_4_ * 0.0;
        auVar93._24_4_ = auVar141._24_4_ * 0.0;
        auVar93._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar88),auVar137);
        auVar118._4_4_ = auVar112._4_4_ * auVar137._4_4_;
        auVar118._0_4_ = auVar112._0_4_ * auVar137._0_4_;
        auVar118._8_4_ = auVar112._8_4_ * auVar137._8_4_;
        auVar118._12_4_ = auVar112._12_4_ * auVar137._12_4_;
        auVar118._16_4_ = auVar137._16_4_ * 0.0;
        auVar118._20_4_ = auVar137._20_4_ * 0.0;
        auVar118._24_4_ = auVar137._24_4_ * 0.0;
        auVar118._28_4_ = auVar137._28_4_;
        auVar178 = ZEXT1632(auVar112);
        auVar137 = vsubps_avx(ZEXT1632(auVar89),auVar178);
        auVar11 = vfmsub231ps_fma(auVar118,ZEXT1632(auVar151),auVar137);
        auVar28._4_4_ = auVar88._4_4_ * auVar137._4_4_;
        auVar28._0_4_ = auVar88._0_4_ * auVar137._0_4_;
        auVar28._8_4_ = auVar88._8_4_ * auVar137._8_4_;
        auVar28._12_4_ = auVar88._12_4_ * auVar137._12_4_;
        auVar28._16_4_ = auVar137._16_4_ * 0.0;
        auVar28._20_4_ = auVar137._20_4_ * 0.0;
        auVar28._24_4_ = auVar137._24_4_ * 0.0;
        auVar28._28_4_ = auVar137._28_4_;
        auVar112 = vfmsub231ps_fma(auVar28,auVar178,auVar141);
        auVar141 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar141,ZEXT1632(auVar11));
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar141,ZEXT1632(auVar13));
        auVar168 = vcmpps_avx(ZEXT1632(auVar11),ZEXT1232(ZEXT812(0)) << 0x20,2);
        auVar141 = vblendvps_avx(ZEXT1632(auVar113),ZEXT1632(auVar16),auVar168);
        auVar137 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar90),auVar168);
        auVar146 = vblendvps_avx(ZEXT1632(auVar87),local_500,auVar168);
        auVar101 = vblendvps_avx(auVar178,ZEXT1632(auVar89),auVar168);
        auVar123 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar128),auVar168);
        auVar183 = vblendvps_avx(ZEXT1632(auVar151),ZEXT1632(auVar12),auVar168);
        auVar178 = vblendvps_avx(ZEXT1632(auVar89),auVar178,auVar168);
        auVar100 = vblendvps_avx(ZEXT1632(auVar128),ZEXT1632(auVar88),auVar168);
        auVar11 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auVar94 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar151),auVar168);
        auVar179 = vsubps_avx(auVar178,auVar141);
        auVar100 = vsubps_avx(auVar100,auVar137);
        auVar193 = vsubps_avx(auVar94,auVar146);
        auVar93 = vsubps_avx(auVar141,auVar101);
        auVar118 = vsubps_avx(auVar137,auVar123);
        auVar119 = vsubps_avx(auVar146,auVar183);
        auVar29._4_4_ = auVar193._4_4_ * auVar141._4_4_;
        auVar29._0_4_ = auVar193._0_4_ * auVar141._0_4_;
        auVar29._8_4_ = auVar193._8_4_ * auVar141._8_4_;
        auVar29._12_4_ = auVar193._12_4_ * auVar141._12_4_;
        auVar29._16_4_ = auVar193._16_4_ * auVar141._16_4_;
        auVar29._20_4_ = auVar193._20_4_ * auVar141._20_4_;
        auVar29._24_4_ = auVar193._24_4_ * auVar141._24_4_;
        auVar29._28_4_ = auVar94._28_4_;
        auVar12 = vfmsub231ps_fma(auVar29,auVar146,auVar179);
        auVar30._4_4_ = auVar179._4_4_ * auVar137._4_4_;
        auVar30._0_4_ = auVar179._0_4_ * auVar137._0_4_;
        auVar30._8_4_ = auVar179._8_4_ * auVar137._8_4_;
        auVar30._12_4_ = auVar179._12_4_ * auVar137._12_4_;
        auVar30._16_4_ = auVar179._16_4_ * auVar137._16_4_;
        auVar30._20_4_ = auVar179._20_4_ * auVar137._20_4_;
        auVar30._24_4_ = auVar179._24_4_ * auVar137._24_4_;
        auVar30._28_4_ = auVar178._28_4_;
        auVar13 = vfmsub231ps_fma(auVar30,auVar141,auVar100);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar97._0_4_ = auVar100._0_4_ * auVar146._0_4_;
        auVar97._4_4_ = auVar100._4_4_ * auVar146._4_4_;
        auVar97._8_4_ = auVar100._8_4_ * auVar146._8_4_;
        auVar97._12_4_ = auVar100._12_4_ * auVar146._12_4_;
        auVar97._16_4_ = auVar100._16_4_ * auVar146._16_4_;
        auVar97._20_4_ = auVar100._20_4_ * auVar146._20_4_;
        auVar97._24_4_ = auVar100._24_4_ * auVar146._24_4_;
        auVar97._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar97,auVar137,auVar193);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar143 = ZEXT1664(auVar13);
        auVar98._0_4_ = auVar119._0_4_ * auVar101._0_4_;
        auVar98._4_4_ = auVar119._4_4_ * auVar101._4_4_;
        auVar98._8_4_ = auVar119._8_4_ * auVar101._8_4_;
        auVar98._12_4_ = auVar119._12_4_ * auVar101._12_4_;
        auVar98._16_4_ = auVar119._16_4_ * auVar101._16_4_;
        auVar98._20_4_ = auVar119._20_4_ * auVar101._20_4_;
        auVar98._24_4_ = auVar119._24_4_ * auVar101._24_4_;
        auVar98._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar98,auVar93,auVar183);
        auVar31._4_4_ = auVar118._4_4_ * auVar183._4_4_;
        auVar31._0_4_ = auVar118._0_4_ * auVar183._0_4_;
        auVar31._8_4_ = auVar118._8_4_ * auVar183._8_4_;
        auVar31._12_4_ = auVar118._12_4_ * auVar183._12_4_;
        auVar31._16_4_ = auVar118._16_4_ * auVar183._16_4_;
        auVar31._20_4_ = auVar118._20_4_ * auVar183._20_4_;
        auVar31._24_4_ = auVar118._24_4_ * auVar183._24_4_;
        auVar31._28_4_ = auVar183._28_4_;
        auVar16 = vfmsub231ps_fma(auVar31,auVar123,auVar119);
        auVar32._4_4_ = auVar93._4_4_ * auVar123._4_4_;
        auVar32._0_4_ = auVar93._0_4_ * auVar123._0_4_;
        auVar32._8_4_ = auVar93._8_4_ * auVar123._8_4_;
        auVar32._12_4_ = auVar93._12_4_ * auVar123._12_4_;
        auVar32._16_4_ = auVar93._16_4_ * auVar123._16_4_;
        auVar32._20_4_ = auVar93._20_4_ * auVar123._20_4_;
        auVar32._24_4_ = auVar93._24_4_ * auVar123._24_4_;
        auVar32._28_4_ = auVar123._28_4_;
        auVar90 = vfmsub231ps_fma(auVar32,auVar118,auVar101);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar90),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar101 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar16));
        auVar101 = vcmpps_avx(auVar101,ZEXT832(0) << 0x20,2);
        auVar12 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        auVar11 = vpand_avx(auVar12,auVar11);
        auVar101 = vpmovsxwd_avx2(auVar11);
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar101 >> 0x7f,0) == '\0') &&
              (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar101 >> 0xbf,0) == '\0') &&
            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar101[0x1f]) {
LAB_015f19d1:
          auVar169 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar184 = ZEXT3264(local_560);
          auVar126 = ZEXT3264(local_580);
        }
        else {
          auVar33._4_4_ = auVar100._4_4_ * auVar119._4_4_;
          auVar33._0_4_ = auVar100._0_4_ * auVar119._0_4_;
          auVar33._8_4_ = auVar100._8_4_ * auVar119._8_4_;
          auVar33._12_4_ = auVar100._12_4_ * auVar119._12_4_;
          auVar33._16_4_ = auVar100._16_4_ * auVar119._16_4_;
          auVar33._20_4_ = auVar100._20_4_ * auVar119._20_4_;
          auVar33._24_4_ = auVar100._24_4_ * auVar119._24_4_;
          auVar33._28_4_ = auVar101._28_4_;
          auVar128 = vfmsub231ps_fma(auVar33,auVar118,auVar193);
          auVar121._0_4_ = auVar93._0_4_ * auVar193._0_4_;
          auVar121._4_4_ = auVar93._4_4_ * auVar193._4_4_;
          auVar121._8_4_ = auVar93._8_4_ * auVar193._8_4_;
          auVar121._12_4_ = auVar93._12_4_ * auVar193._12_4_;
          auVar121._16_4_ = auVar93._16_4_ * auVar193._16_4_;
          auVar121._20_4_ = auVar93._20_4_ * auVar193._20_4_;
          auVar121._24_4_ = auVar93._24_4_ * auVar193._24_4_;
          auVar121._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar121,auVar179,auVar119);
          auVar34._4_4_ = auVar179._4_4_ * auVar118._4_4_;
          auVar34._0_4_ = auVar179._0_4_ * auVar118._0_4_;
          auVar34._8_4_ = auVar179._8_4_ * auVar118._8_4_;
          auVar34._12_4_ = auVar179._12_4_ * auVar118._12_4_;
          auVar34._16_4_ = auVar179._16_4_ * auVar118._16_4_;
          auVar34._20_4_ = auVar179._20_4_ * auVar118._20_4_;
          auVar34._24_4_ = auVar179._24_4_ * auVar118._24_4_;
          auVar34._28_4_ = auVar179._28_4_;
          auVar112 = vfmsub231ps_fma(auVar34,auVar93,auVar100);
          auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar112));
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar128),_DAT_01faff00);
          auVar101 = vrcpps_avx(ZEXT1632(auVar90));
          auVar191._8_4_ = 0x3f800000;
          auVar191._0_8_ = 0x3f8000003f800000;
          auVar191._12_4_ = 0x3f800000;
          auVar191._16_4_ = 0x3f800000;
          auVar191._20_4_ = 0x3f800000;
          auVar191._24_4_ = 0x3f800000;
          auVar191._28_4_ = 0x3f800000;
          auVar12 = vfnmadd213ps_fma(auVar101,ZEXT1632(auVar90),auVar191);
          auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar101,auVar101);
          auVar160._0_4_ = auVar146._0_4_ * auVar112._0_4_;
          auVar160._4_4_ = auVar146._4_4_ * auVar112._4_4_;
          auVar160._8_4_ = auVar146._8_4_ * auVar112._8_4_;
          auVar160._12_4_ = auVar146._12_4_ * auVar112._12_4_;
          auVar160._16_4_ = auVar146._16_4_ * 0.0;
          auVar160._20_4_ = auVar146._20_4_ * 0.0;
          auVar160._24_4_ = auVar146._24_4_ * 0.0;
          auVar160._28_4_ = 0;
          auVar89 = vfmadd231ps_fma(auVar160,auVar137,ZEXT1632(auVar89));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar128),auVar141);
          fVar127 = auVar12._0_4_;
          fVar103 = auVar12._4_4_;
          fVar105 = auVar12._8_4_;
          fVar106 = auVar12._12_4_;
          auVar146 = ZEXT1632(CONCAT412(fVar106 * auVar89._12_4_,
                                        CONCAT48(fVar105 * auVar89._8_4_,
                                                 CONCAT44(fVar103 * auVar89._4_4_,
                                                          fVar127 * auVar89._0_4_))));
          auVar99._4_4_ = uVar83;
          auVar99._0_4_ = uVar83;
          auVar99._8_4_ = uVar83;
          auVar99._12_4_ = uVar83;
          auVar99._16_4_ = uVar83;
          auVar99._20_4_ = uVar83;
          auVar99._24_4_ = uVar83;
          auVar99._28_4_ = uVar83;
          uVar110 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar122._4_4_ = uVar110;
          auVar122._0_4_ = uVar110;
          auVar122._8_4_ = uVar110;
          auVar122._12_4_ = uVar110;
          auVar122._16_4_ = uVar110;
          auVar122._20_4_ = uVar110;
          auVar122._24_4_ = uVar110;
          auVar122._28_4_ = uVar110;
          auVar141 = vcmpps_avx(auVar99,auVar146,2);
          auVar137 = vcmpps_avx(auVar146,auVar122,2);
          auVar141 = vandps_avx(auVar137,auVar141);
          auVar12 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
          auVar11 = vpand_avx(auVar11,auVar12);
          auVar141 = vpmovsxwd_avx2(auVar11);
          if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar141 >> 0x7f,0) == '\0') &&
                (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar141 >> 0xbf,0) == '\0') &&
              (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar141[0x1f]) goto LAB_015f19d1;
          auVar141 = vcmpps_avx(ZEXT1632(auVar90),ZEXT832(0) << 0x20,4);
          auVar12 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
          auVar11 = vpand_avx(auVar11,auVar12);
          auVar141 = vpmovsxwd_avx2(auVar11);
          auVar169 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar184 = ZEXT3264(local_560);
          auVar126 = ZEXT3264(local_580);
          if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar141 >> 0x7f,0) != '\0') ||
                (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar141 >> 0xbf,0) != '\0') ||
              (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar141[0x1f] < '\0') {
            auVar101 = ZEXT1632(CONCAT412(fVar106 * auVar13._12_4_,
                                          CONCAT48(fVar105 * auVar13._8_4_,
                                                   CONCAT44(fVar103 * auVar13._4_4_,
                                                            fVar127 * auVar13._0_4_))));
            auVar123 = ZEXT1632(CONCAT412(fVar106 * auVar16._12_4_,
                                          CONCAT48(fVar105 * auVar16._8_4_,
                                                   CONCAT44(fVar103 * auVar16._4_4_,
                                                            fVar127 * auVar16._0_4_))));
            auVar154._8_4_ = 0x3f800000;
            auVar154._0_8_ = 0x3f8000003f800000;
            auVar154._12_4_ = 0x3f800000;
            auVar154._16_4_ = 0x3f800000;
            auVar154._20_4_ = 0x3f800000;
            auVar154._24_4_ = 0x3f800000;
            auVar154._28_4_ = 0x3f800000;
            auVar137 = vsubps_avx(auVar154,auVar101);
            auVar143 = ZEXT3264(auVar137);
            auVar137 = vblendvps_avx(auVar137,auVar101,auVar168);
            auVar184 = ZEXT3264(auVar137);
            auVar137 = vsubps_avx(auVar154,auVar123);
            local_380 = vblendvps_avx(auVar137,auVar123,auVar168);
            auVar169 = ZEXT3264(auVar141);
            auVar126 = ZEXT3264(auVar146);
          }
        }
        local_560 = auVar184._0_32_;
        auVar179 = auVar126._0_32_;
        auVar141 = auVar169._0_32_;
        if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar141 >> 0x7f,0) == '\0') &&
              (auVar169 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar141 >> 0xbf,0) == '\0') &&
            (auVar169 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar169[0x1f]) goto LAB_015f0538;
        auVar137 = vsubps_avx(ZEXT1632(auVar14),auVar198);
        auVar11 = vfmadd213ps_fma(auVar137,local_560,auVar198);
        fVar127 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar35._4_4_ = (auVar11._4_4_ + auVar11._4_4_) * fVar127;
        auVar35._0_4_ = (auVar11._0_4_ + auVar11._0_4_) * fVar127;
        auVar35._8_4_ = (auVar11._8_4_ + auVar11._8_4_) * fVar127;
        auVar35._12_4_ = (auVar11._12_4_ + auVar11._12_4_) * fVar127;
        auVar35._16_4_ = fVar127 * 0.0;
        auVar35._20_4_ = fVar127 * 0.0;
        auVar35._24_4_ = fVar127 * 0.0;
        auVar35._28_4_ = 0;
        auVar137 = vcmpps_avx(auVar179,auVar35,6);
        auVar146 = auVar141 & auVar137;
        auVar169 = ZEXT3264(CONCAT428(local_6e0,
                                      CONCAT424(local_6e0,
                                                CONCAT420(local_6e0,
                                                          CONCAT416(local_6e0,
                                                                    CONCAT412(local_6e0,
                                                                              CONCAT48(local_6e0,
                                                                                       CONCAT44(
                                                  local_6e0,local_6e0))))))));
        auVar175 = ZEXT3264(local_720);
        auVar101 = local_560;
        if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar146 >> 0x7f,0) != '\0') ||
              (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar146 >> 0xbf,0) != '\0') ||
            (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar146[0x1f] < '\0') {
          auVar124._8_4_ = 0xbf800000;
          auVar124._0_8_ = 0xbf800000bf800000;
          auVar124._12_4_ = 0xbf800000;
          auVar124._16_4_ = 0xbf800000;
          auVar124._20_4_ = 0xbf800000;
          auVar124._24_4_ = 0xbf800000;
          auVar124._28_4_ = 0xbf800000;
          auVar139._8_4_ = 0x40000000;
          auVar139._0_8_ = 0x4000000040000000;
          auVar139._12_4_ = 0x40000000;
          auVar139._16_4_ = 0x40000000;
          auVar139._20_4_ = 0x40000000;
          auVar139._24_4_ = 0x40000000;
          auVar139._28_4_ = 0x40000000;
          auVar11 = vfmadd213ps_fma(local_380,auVar139,auVar124);
          local_240 = ZEXT1632(auVar11);
          local_200 = 0;
          local_1f0 = local_5d0._0_8_;
          uStack_1e8 = local_5d0._8_8_;
          local_1e0 = local_690._0_8_;
          uStack_1d8 = local_690._8_8_;
          auVar143 = ZEXT1664(local_6a0);
          local_380 = local_240;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            auVar149 = ZEXT3264(local_700);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar78 = true, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar141 = vandps_avx(auVar137,auVar141);
              fVar127 = 1.0 / auVar95._0_4_;
              auVar143 = ZEXT3264(CONCAT428(fVar127,CONCAT424(fVar127,CONCAT420(fVar127,CONCAT416(
                                                  fVar127,CONCAT412(fVar127,CONCAT48(fVar127,
                                                  CONCAT44(fVar127,fVar127))))))));
              local_180[0] = fVar127 * (auVar184._0_4_ + 0.0);
              local_180[1] = fVar127 * (auVar184._4_4_ + 1.0);
              local_180[2] = fVar127 * (auVar184._8_4_ + 2.0);
              local_180[3] = fVar127 * (auVar184._12_4_ + 3.0);
              fStack_170 = fVar127 * (auVar184._16_4_ + 4.0);
              fStack_16c = fVar127 * (auVar184._20_4_ + 5.0);
              fStack_168 = fVar127 * (auVar184._24_4_ + 6.0);
              fStack_164 = auVar184._28_4_ + 7.0;
              local_380._0_8_ = auVar11._0_8_;
              local_380._8_8_ = auVar11._8_8_;
              local_160 = local_380._0_8_;
              uStack_158 = local_380._8_8_;
              uStack_150 = 0;
              uStack_148 = 0;
              local_140 = auVar179;
              uVar83 = vmovmskps_avx(auVar141);
              if (uVar83 == 0) goto LAB_015f061c;
              uVar80 = 0;
              uVar85 = (ulong)(uVar83 & 0xff);
              for (uVar82 = uVar85; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                uVar80 = uVar80 + 1;
              }
              local_7c0._0_4_ = local_7c0._4_4_;
              local_7c0._8_4_ = local_7c0._4_4_;
              local_7c0._12_4_ = local_7c0._4_4_;
              local_620._0_8_ = CONCAT44(uVar7,uVar7);
              local_620 = ZEXT1632(CONCAT412(uVar7,CONCAT48(uVar7,local_620._0_8_)));
              local_5c0 = ZEXT1632(*local_678);
              local_4e0 = ZEXT1632(CONCAT124(auVar15._4_12_,*(undefined4 *)(ray + k * 4 + 0x80)));
              local_580 = auVar179;
              _local_320 = *pauVar1;
              local_260 = local_560;
              local_220 = auVar179;
              local_1fc = iVar8;
              local_1d0 = local_6a0;
              do {
                local_400 = local_180[uVar80];
                local_3f0 = *(undefined4 *)((long)&local_160 + uVar80 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar80 * 4);
                fVar105 = 1.0 - local_400;
                auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * fVar105)),
                                          ZEXT416((uint)(local_400 * fVar105)),ZEXT416(0xc0000000));
                auVar11 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar105)),
                                          ZEXT416((uint)(local_400 * local_400)),ZEXT416(0x40000000)
                                         );
                fVar127 = auVar11._0_4_ * 3.0;
                fVar103 = local_400 * local_400 * 3.0;
                auVar158._0_4_ = fVar103 * (float)local_490._0_4_;
                auVar158._4_4_ = fVar103 * (float)local_490._4_4_;
                auVar158._8_4_ = fVar103 * fStack_488;
                auVar158._12_4_ = fVar103 * fStack_484;
                auVar131._4_4_ = fVar127;
                auVar131._0_4_ = fVar127;
                auVar131._8_4_ = fVar127;
                auVar131._12_4_ = fVar127;
                auVar11 = vfmadd132ps_fma(auVar131,auVar158,local_6a0);
                fVar127 = auVar12._0_4_ * 3.0;
                auVar152._4_4_ = fVar127;
                auVar152._0_4_ = fVar127;
                auVar152._8_4_ = fVar127;
                auVar152._12_4_ = fVar127;
                auVar11 = vfmadd132ps_fma(auVar152,auVar11,local_690);
                fVar127 = fVar105 * fVar105 * -3.0;
                local_670.context = context->user;
                auVar132._4_4_ = fVar127;
                auVar132._0_4_ = fVar127;
                auVar132._8_4_ = fVar127;
                auVar132._12_4_ = fVar127;
                auVar11 = vfmadd132ps_fma(auVar132,auVar11,local_5d0);
                local_430 = auVar11._0_4_;
                local_420 = vshufps_avx(auVar11,auVar11,0x55);
                local_410 = vshufps_avx(auVar11,auVar11,0xaa);
                auVar143 = ZEXT1664(local_410);
                local_3e0 = local_620._0_8_;
                uStack_3d8 = local_620._8_8_;
                local_3d0 = local_7c0;
                vpcmpeqd_avx2(ZEXT1632(local_7c0),ZEXT1632(local_7c0));
                uStack_3bc = (local_670.context)->instID[0];
                local_3c0 = uStack_3bc;
                uStack_3b8 = uStack_3bc;
                uStack_3b4 = uStack_3bc;
                uStack_3b0 = (local_670.context)->instPrimID[0];
                uStack_3ac = uStack_3b0;
                uStack_3a8 = uStack_3b0;
                uStack_3a4 = uStack_3b0;
                local_760 = local_5c0._0_16_;
                local_670.valid = (int *)local_760;
                local_670.geometryUserPtr = pGVar9->userPtr;
                local_670.hit = (RTCHitN *)&local_430;
                local_670.N = 4;
                local_670.ray = (RTCRayN *)ray;
                uStack_42c = local_430;
                uStack_428 = local_430;
                uStack_424 = local_430;
                fStack_3fc = local_400;
                fStack_3f8 = local_400;
                fStack_3f4 = local_400;
                uStack_3ec = local_3f0;
                uStack_3e8 = local_3f0;
                uStack_3e4 = local_3f0;
                if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar143 = ZEXT1664(local_410);
                  (*pGVar9->occlusionFilterN)(&local_670);
                  auVar175 = ZEXT3264(local_720);
                  auVar169 = ZEXT3264(CONCAT428(fStack_6c4,
                                                CONCAT424(fStack_6c8,
                                                          CONCAT420(fStack_6cc,
                                                                    CONCAT416(fStack_6d0,
                                                                              CONCAT412(fStack_6d4,
                                                                                        CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
                  auVar126 = ZEXT3264(local_580);
                  auVar184 = ZEXT3264(local_560);
                }
                if (local_760 == (undefined1  [16])0x0) {
                  auVar11 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar11 = auVar11 ^ _DAT_01f7ae20;
                  auVar149 = ZEXT3264(local_700);
                }
                else {
                  p_Var10 = context->args->filter;
                  if (p_Var10 == (RTCFilterFunctionN)0x0) {
                    auVar149 = ZEXT3264(local_700);
                  }
                  else {
                    auVar149 = ZEXT3264(local_700);
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var10)(&local_670);
                      auVar149 = ZEXT3264(local_700);
                      auVar175 = ZEXT3264(local_720);
                      auVar169 = ZEXT3264(CONCAT428(fStack_6c4,
                                                    CONCAT424(fStack_6c8,
                                                              CONCAT420(fStack_6cc,
                                                                        CONCAT416(fStack_6d0,
                                                                                  CONCAT412(
                                                  fStack_6d4,
                                                  CONCAT48(fStack_6d8,CONCAT44(fStack_6dc,local_6e0)
                                                          )))))));
                      auVar126 = ZEXT3264(local_580);
                      auVar184 = ZEXT3264(local_560);
                    }
                  }
                  auVar12 = vpcmpeqd_avx(local_760,_DAT_01f7aa10);
                  auVar11 = auVar12 ^ _DAT_01f7ae20;
                  auVar133._8_4_ = 0xff800000;
                  auVar133._0_8_ = 0xff800000ff800000;
                  auVar133._12_4_ = 0xff800000;
                  auVar143 = ZEXT1664(auVar133);
                  auVar12 = vblendvps_avx(auVar133,*(undefined1 (*) [16])(local_670.ray + 0x80),
                                          auVar12);
                  *(undefined1 (*) [16])(local_670.ray + 0x80) = auVar12;
                }
                auVar179 = auVar126._0_32_;
                auVar115._8_8_ = 0x100000001;
                auVar115._0_8_ = 0x100000001;
                auVar101 = auVar184._0_32_;
                if ((auVar115 & auVar11) != (undefined1  [16])0x0) {
                  bVar78 = true;
                  break;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = local_4e0._0_4_;
                uVar82 = uVar80 & 0x3f;
                bVar78 = false;
                uVar80 = 0;
                uVar85 = uVar85 ^ 1L << uVar82;
                for (uVar82 = uVar85; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000)
                {
                  uVar80 = uVar80 + 1;
                }
              } while (uVar85 != 0);
            }
            goto LAB_015f0553;
          }
          goto LAB_015f054a;
        }
LAB_015f061c:
        auVar149 = ZEXT3264(local_700);
        bVar78 = false;
      }
LAB_015f0553:
      local_560 = auVar101;
      auVar197 = ZEXT3264(local_800);
      auVar184 = ZEXT3264(local_7e0);
      auVar126 = ZEXT3264(local_6c0);
      local_580 = auVar179;
      if (8 < iVar8) {
        local_500._4_4_ = iVar8;
        local_500._0_4_ = iVar8;
        local_500._8_4_ = iVar8;
        local_500._12_4_ = iVar8;
        local_500._16_4_ = iVar8;
        local_500._20_4_ = iVar8;
        local_500._24_4_ = iVar8;
        local_500._28_4_ = iVar8;
        local_360._4_4_ = local_740._0_4_;
        local_360._0_4_ = local_740._0_4_;
        local_360._8_4_ = local_740._0_4_;
        local_360._12_4_ = local_740._0_4_;
        local_360._16_4_ = local_740._0_4_;
        local_360._20_4_ = local_740._0_4_;
        local_360._24_4_ = local_740._0_4_;
        local_360._28_4_ = local_740._0_4_;
        local_100 = local_640._0_4_;
        uStack_fc = local_640._0_4_;
        uStack_f8 = local_640._0_4_;
        uStack_f4 = local_640._0_4_;
        uStack_f0 = local_640._0_4_;
        uStack_ec = local_640._0_4_;
        uStack_e8 = local_640._0_4_;
        uStack_e4 = local_640._0_4_;
        local_120 = 1.0 / (float)local_5e0._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_5e0._4_4_ = (undefined4)local_748;
        local_5e0._0_4_ = (undefined4)local_748;
        uStack_5d8 = (undefined4)local_748;
        uStack_5d4 = (undefined4)local_748;
        local_5f0 = CONCAT44((undefined4)local_5f0,(undefined4)local_5f0);
        uStack_5e8 = (undefined4)local_5f0;
        uStack_5e4 = (undefined4)local_5f0;
        lVar81 = 8;
        do {
          auVar193 = auVar197._0_32_;
          auVar179 = auVar184._0_32_;
          local_740 = *(undefined1 (*) [32])(bezier_basis0 + lVar81 * 4 + lVar17);
          auVar141 = *(undefined1 (*) [32])(lVar17 + 0x21aa768 + lVar81 * 4);
          auVar137 = *(undefined1 (*) [32])(lVar17 + 0x21aabec + lVar81 * 4);
          pauVar1 = (undefined1 (*) [32])(lVar17 + 0x21ab070 + lVar81 * 4);
          fVar67 = *(float *)*pauVar1;
          fVar68 = *(float *)(*pauVar1 + 4);
          fVar69 = *(float *)(*pauVar1 + 8);
          fVar70 = *(float *)(*pauVar1 + 0xc);
          fVar71 = *(float *)(*pauVar1 + 0x10);
          fVar72 = *(float *)(*pauVar1 + 0x14);
          fVar73 = *(float *)(*pauVar1 + 0x18);
          auVar76 = *(undefined1 (*) [28])*pauVar1;
          auVar196._0_4_ = fVar67 * auVar169._0_4_;
          auVar196._4_4_ = fVar68 * auVar169._4_4_;
          auVar196._8_4_ = fVar69 * auVar169._8_4_;
          auVar196._12_4_ = fVar70 * auVar169._12_4_;
          auVar196._16_4_ = fVar71 * auVar169._16_4_;
          auVar196._20_4_ = fVar72 * auVar169._20_4_;
          auVar196._28_36_ = auVar197._28_36_;
          auVar196._24_4_ = fVar73 * auVar169._24_4_;
          auVar184._0_4_ = fVar67 * fVar102;
          auVar184._4_4_ = fVar68 * fVar104;
          auVar184._8_4_ = fVar69 * fVar102;
          auVar184._12_4_ = fVar70 * fVar104;
          auVar184._16_4_ = fVar71 * fVar102;
          auVar184._20_4_ = fVar72 * fVar104;
          auVar184._28_36_ = auVar143._28_36_;
          auVar184._24_4_ = fVar73 * fVar102;
          auVar11 = vfmadd231ps_fma(auVar196._0_32_,auVar137,auVar117);
          auVar12 = vfmadd231ps_fma(auVar184._0_32_,auVar137,auVar188);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar141,auVar175._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar141,auVar126._0_32_);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_740,auVar149._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_740,local_4c0);
          auVar146 = *(undefined1 (*) [32])(bezier_basis1 + lVar81 * 4 + lVar17);
          auVar101 = *(undefined1 (*) [32])(lVar17 + 0x21acb88 + lVar81 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar17 + 0x21ad00c + lVar81 * 4);
          pfVar2 = (float *)(lVar17 + 0x21ad490 + lVar81 * 4);
          fVar74 = *pfVar2;
          fVar199 = pfVar2[1];
          fVar204 = pfVar2[2];
          fVar205 = pfVar2[3];
          fVar206 = pfVar2[4];
          fVar207 = pfVar2[5];
          fVar208 = pfVar2[6];
          auVar36._4_4_ = fVar199 * auVar169._4_4_;
          auVar36._0_4_ = fVar74 * auVar169._0_4_;
          auVar36._8_4_ = fVar204 * auVar169._8_4_;
          auVar36._12_4_ = fVar205 * auVar169._12_4_;
          auVar36._16_4_ = fVar206 * auVar169._16_4_;
          auVar36._20_4_ = fVar207 * auVar169._20_4_;
          auVar36._24_4_ = fVar208 * auVar169._24_4_;
          auVar36._28_4_ = auVar141._28_4_;
          auVar197._0_4_ = fVar74 * fVar102;
          auVar197._4_4_ = fVar199 * fVar104;
          auVar197._8_4_ = fVar204 * fVar102;
          auVar197._12_4_ = fVar205 * fVar104;
          auVar197._16_4_ = fVar206 * fVar102;
          auVar197._20_4_ = fVar207 * fVar104;
          auVar197._28_36_ = auVar169._28_36_;
          auVar197._24_4_ = fVar208 * fVar102;
          auVar13 = vfmadd231ps_fma(auVar36,auVar123,auVar117);
          auVar14 = vfmadd231ps_fma(auVar197._0_32_,auVar123,auVar188);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar101,auVar175._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar101,auVar126._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar146,auVar149._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar146,local_4c0);
          local_5c0 = ZEXT1632(auVar13);
          local_4e0 = ZEXT1632(auVar11);
          local_640 = vsubps_avx(local_5c0,local_4e0);
          auVar168 = ZEXT1632(auVar14);
          auVar94 = ZEXT1632(auVar12);
          local_300 = vsubps_avx(auVar168,auVar94);
          auVar37._4_4_ = auVar12._4_4_ * local_640._4_4_;
          auVar37._0_4_ = auVar12._0_4_ * local_640._0_4_;
          auVar37._8_4_ = auVar12._8_4_ * local_640._8_4_;
          auVar37._12_4_ = auVar12._12_4_ * local_640._12_4_;
          auVar37._16_4_ = local_640._16_4_ * 0.0;
          auVar37._20_4_ = local_640._20_4_ * 0.0;
          auVar37._24_4_ = local_640._24_4_ * 0.0;
          auVar37._28_4_ = auVar146._28_4_;
          fVar127 = local_300._0_4_;
          auVar143._0_4_ = auVar11._0_4_ * fVar127;
          fVar103 = local_300._4_4_;
          auVar143._4_4_ = auVar11._4_4_ * fVar103;
          fVar105 = local_300._8_4_;
          auVar143._8_4_ = auVar11._8_4_ * fVar105;
          fVar106 = local_300._12_4_;
          auVar143._12_4_ = auVar11._12_4_ * fVar106;
          fVar107 = local_300._16_4_;
          auVar143._16_4_ = fVar107 * 0.0;
          fVar108 = local_300._20_4_;
          auVar143._20_4_ = fVar108 * 0.0;
          fVar109 = local_300._24_4_;
          auVar143._28_36_ = auVar126._28_36_;
          auVar143._24_4_ = fVar109 * 0.0;
          auVar178 = vsubps_avx(auVar37,auVar143._0_32_);
          auVar140._0_4_ = fVar67 * (float)local_2a0._0_4_;
          auVar140._4_4_ = fVar68 * (float)local_2a0._4_4_;
          auVar140._8_4_ = fVar69 * fStack_298;
          auVar140._12_4_ = fVar70 * fStack_294;
          auVar140._16_4_ = fVar71 * fStack_290;
          auVar140._20_4_ = fVar72 * fStack_28c;
          auVar140._24_4_ = fVar73 * fStack_288;
          auVar140._28_4_ = 0;
          auVar11 = vfmadd231ps_fma(auVar140,local_a0,auVar137);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_80,auVar141);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_280,local_740);
          auVar143 = ZEXT1664(auVar11);
          auVar38._4_4_ = fVar199 * (float)local_2a0._4_4_;
          auVar38._0_4_ = fVar74 * (float)local_2a0._0_4_;
          auVar38._8_4_ = fVar204 * fStack_298;
          auVar38._12_4_ = fVar205 * fStack_294;
          auVar38._16_4_ = fVar206 * fStack_290;
          auVar38._20_4_ = fVar207 * fStack_28c;
          auVar38._24_4_ = fVar208 * fStack_288;
          auVar38._28_4_ = uStack_284;
          auVar12 = vfmadd231ps_fma(auVar38,auVar123,local_a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar101,local_80);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar146,local_280);
          auVar39._4_4_ = fVar103 * fVar103;
          auVar39._0_4_ = fVar127 * fVar127;
          auVar39._8_4_ = fVar105 * fVar105;
          auVar39._12_4_ = fVar106 * fVar106;
          auVar39._16_4_ = fVar107 * fVar107;
          auVar39._20_4_ = fVar108 * fVar108;
          auVar39._24_4_ = fVar109 * fVar109;
          auVar39._28_4_ = local_280._28_4_;
          auVar13 = vfmadd231ps_fma(auVar39,local_640,local_640);
          local_480 = ZEXT1632(auVar12);
          auVar183 = vmaxps_avx(ZEXT1632(auVar11),local_480);
          auVar180._0_4_ = auVar183._0_4_ * auVar183._0_4_ * auVar13._0_4_;
          auVar180._4_4_ = auVar183._4_4_ * auVar183._4_4_ * auVar13._4_4_;
          auVar180._8_4_ = auVar183._8_4_ * auVar183._8_4_ * auVar13._8_4_;
          auVar180._12_4_ = auVar183._12_4_ * auVar183._12_4_ * auVar13._12_4_;
          auVar180._16_4_ = auVar183._16_4_ * auVar183._16_4_ * 0.0;
          auVar180._20_4_ = auVar183._20_4_ * auVar183._20_4_ * 0.0;
          auVar180._24_4_ = auVar183._24_4_ * auVar183._24_4_ * 0.0;
          auVar180._28_4_ = 0;
          auVar40._4_4_ = auVar178._4_4_ * auVar178._4_4_;
          auVar40._0_4_ = auVar178._0_4_ * auVar178._0_4_;
          auVar40._8_4_ = auVar178._8_4_ * auVar178._8_4_;
          auVar40._12_4_ = auVar178._12_4_ * auVar178._12_4_;
          auVar40._16_4_ = auVar178._16_4_ * auVar178._16_4_;
          auVar40._20_4_ = auVar178._20_4_ * auVar178._20_4_;
          auVar40._24_4_ = auVar178._24_4_ * auVar178._24_4_;
          auVar40._28_4_ = auVar178._28_4_;
          auVar183 = vcmpps_avx(auVar40,auVar180,2);
          local_200 = (int)lVar81;
          auVar181._4_4_ = local_200;
          auVar181._0_4_ = local_200;
          auVar181._8_4_ = local_200;
          auVar181._12_4_ = local_200;
          auVar181._16_4_ = local_200;
          auVar181._20_4_ = local_200;
          auVar181._24_4_ = local_200;
          auVar181._28_4_ = local_200;
          auVar178 = vpor_avx2(auVar181,_DAT_01fe9900);
          auVar100 = vpcmpgtd_avx2(local_500,auVar178);
          auVar178 = auVar100 & auVar183;
          if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar178 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar178 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar178 >> 0x7f,0) == '\0') &&
                (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar178 >> 0xbf,0) == '\0') &&
              (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar178[0x1f]) {
            auVar184 = ZEXT3264(auVar179);
            auVar197 = ZEXT3264(auVar193);
LAB_015f13e4:
            auVar126 = ZEXT3264(local_6c0);
            auVar169 = ZEXT3264(CONCAT428(fStack_6c4,
                                          CONCAT424(fStack_6c8,
                                                    CONCAT420(fStack_6cc,
                                                              CONCAT416(fStack_6d0,
                                                                        CONCAT412(fStack_6d4,
                                                                                  CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
            auVar175 = ZEXT3264(local_720);
          }
          else {
            _local_320 = vandps_avx(auVar100,auVar183);
            auVar41._4_4_ = fVar199 * local_e0._4_4_;
            auVar41._0_4_ = fVar74 * (float)local_e0;
            auVar41._8_4_ = fVar204 * (float)uStack_d8;
            auVar41._12_4_ = fVar205 * uStack_d8._4_4_;
            auVar41._16_4_ = fVar206 * (float)uStack_d0;
            auVar41._20_4_ = fVar207 * uStack_d0._4_4_;
            auVar41._24_4_ = fVar208 * (float)uStack_c8;
            auVar41._28_4_ = auVar183._28_4_;
            auVar12 = vfmadd213ps_fma(auVar123,local_c0,auVar41);
            auVar12 = vfmadd213ps_fma(auVar101,local_460,ZEXT1632(auVar12));
            auVar12 = vfmadd132ps_fma(auVar146,ZEXT1632(auVar12),local_5a0);
            local_340 = ZEXT1632(auVar12);
            local_2e0._0_4_ = auVar76._0_4_;
            local_2e0._4_4_ = auVar76._4_4_;
            fStack_2d8 = auVar76._8_4_;
            fStack_2d4 = auVar76._12_4_;
            fStack_2d0 = auVar76._16_4_;
            fStack_2cc = auVar76._20_4_;
            fStack_2c8 = auVar76._24_4_;
            auVar42._4_4_ = local_e0._4_4_ * (float)local_2e0._4_4_;
            auVar42._0_4_ = (float)local_e0 * (float)local_2e0._0_4_;
            auVar42._8_4_ = (float)uStack_d8 * fStack_2d8;
            auVar42._12_4_ = uStack_d8._4_4_ * fStack_2d4;
            auVar42._16_4_ = (float)uStack_d0 * fStack_2d0;
            auVar42._20_4_ = uStack_d0._4_4_ * fStack_2cc;
            auVar42._24_4_ = (float)uStack_c8 * fStack_2c8;
            auVar42._28_4_ = auVar183._28_4_;
            auVar12 = vfmadd213ps_fma(auVar137,local_c0,auVar42);
            auVar12 = vfmadd213ps_fma(auVar141,local_460,ZEXT1632(auVar12));
            auVar141 = *(undefined1 (*) [32])(lVar17 + 0x21ab4f4 + lVar81 * 4);
            auVar137 = *(undefined1 (*) [32])(lVar17 + 0x21ab978 + lVar81 * 4);
            auVar146 = *(undefined1 (*) [32])(lVar17 + 0x21abdfc + lVar81 * 4);
            pfVar3 = (float *)(lVar17 + 0x21ac280 + lVar81 * 4);
            fVar127 = *pfVar3;
            fVar103 = pfVar3[1];
            fVar105 = pfVar3[2];
            fVar106 = pfVar3[3];
            fVar107 = pfVar3[4];
            fVar108 = pfVar3[5];
            fVar109 = pfVar3[6];
            auVar43._4_4_ = fStack_6dc * fVar103;
            auVar43._0_4_ = local_6e0 * fVar127;
            auVar43._8_4_ = fStack_6d8 * fVar105;
            auVar43._12_4_ = fStack_6d4 * fVar106;
            auVar43._16_4_ = fStack_6d0 * fVar107;
            auVar43._20_4_ = fStack_6cc * fVar108;
            auVar43._24_4_ = fStack_6c8 * fVar109;
            auVar43._28_4_ = pfVar2[7];
            auVar194._0_4_ = fVar102 * fVar127;
            auVar194._4_4_ = fVar104 * fVar103;
            auVar194._8_4_ = fVar102 * fVar105;
            auVar194._12_4_ = fVar104 * fVar106;
            auVar194._16_4_ = fVar102 * fVar107;
            auVar194._20_4_ = fVar104 * fVar108;
            auVar194._24_4_ = fVar102 * fVar109;
            auVar194._28_4_ = 0;
            auVar44._4_4_ = fVar103 * local_e0._4_4_;
            auVar44._0_4_ = fVar127 * (float)local_e0;
            auVar44._8_4_ = fVar105 * (float)uStack_d8;
            auVar44._12_4_ = fVar106 * uStack_d8._4_4_;
            auVar44._16_4_ = fVar107 * (float)uStack_d0;
            auVar44._20_4_ = fVar108 * uStack_d0._4_4_;
            auVar44._24_4_ = fVar109 * (float)uStack_c8;
            auVar44._28_4_ = pfVar3[7];
            auVar13 = vfmadd231ps_fma(auVar43,auVar146,auVar117);
            auVar15 = vfmadd231ps_fma(auVar194,auVar146,auVar188);
            auVar16 = vfmadd231ps_fma(auVar44,local_c0,auVar146);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar137,local_720);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar137,local_6c0);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_460,auVar137);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar141,local_700);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar141,local_4c0);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar141,local_5a0);
            pfVar2 = (float *)(lVar17 + 0x21ae6a0 + lVar81 * 4);
            fVar127 = *pfVar2;
            fVar103 = pfVar2[1];
            fVar105 = pfVar2[2];
            fVar106 = pfVar2[3];
            fVar107 = pfVar2[4];
            fVar108 = pfVar2[5];
            fVar109 = pfVar2[6];
            auVar45._4_4_ = fStack_6dc * fVar103;
            auVar45._0_4_ = local_6e0 * fVar127;
            auVar45._8_4_ = fStack_6d8 * fVar105;
            auVar45._12_4_ = fStack_6d4 * fVar106;
            auVar45._16_4_ = fStack_6d0 * fVar107;
            auVar45._20_4_ = fStack_6cc * fVar108;
            auVar45._24_4_ = fStack_6c8 * fVar109;
            auVar45._28_4_ = fStack_6c4;
            auVar46._4_4_ = fVar104 * fVar103;
            auVar46._0_4_ = fVar102 * fVar127;
            auVar46._8_4_ = fVar102 * fVar105;
            auVar46._12_4_ = fVar104 * fVar106;
            auVar46._16_4_ = fVar102 * fVar107;
            auVar46._20_4_ = fVar104 * fVar108;
            auVar46._24_4_ = fVar102 * fVar109;
            auVar46._28_4_ = fVar104;
            auVar47._4_4_ = local_e0._4_4_ * fVar103;
            auVar47._0_4_ = (float)local_e0 * fVar127;
            auVar47._8_4_ = (float)uStack_d8 * fVar105;
            auVar47._12_4_ = uStack_d8._4_4_ * fVar106;
            auVar47._16_4_ = (float)uStack_d0 * fVar107;
            auVar47._20_4_ = uStack_d0._4_4_ * fVar108;
            auVar47._24_4_ = (float)uStack_c8 * fVar109;
            auVar47._28_4_ = pfVar2[7];
            auVar141 = *(undefined1 (*) [32])(lVar17 + 0x21ae21c + lVar81 * 4);
            auVar90 = vfmadd231ps_fma(auVar45,auVar141,auVar117);
            auVar89 = vfmadd231ps_fma(auVar46,auVar141,auVar188);
            auVar128 = vfmadd231ps_fma(auVar47,local_c0,auVar141);
            auVar141 = *(undefined1 (*) [32])(lVar17 + 0x21add98 + lVar81 * 4);
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar141,local_720);
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar141,local_6c0);
            auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),local_460,auVar141);
            auVar141 = *(undefined1 (*) [32])(lVar17 + 0x21ad914 + lVar81 * 4);
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar141,local_700);
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar141,local_4c0);
            auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),local_5a0,auVar141);
            auVar182._8_4_ = 0x7fffffff;
            auVar182._0_8_ = 0x7fffffff7fffffff;
            auVar182._12_4_ = 0x7fffffff;
            auVar182._16_4_ = 0x7fffffff;
            auVar182._20_4_ = 0x7fffffff;
            auVar182._24_4_ = 0x7fffffff;
            auVar182._28_4_ = 0x7fffffff;
            auVar141 = vandps_avx(ZEXT1632(auVar13),auVar182);
            auVar137 = vandps_avx(ZEXT1632(auVar15),auVar182);
            auVar137 = vmaxps_avx(auVar141,auVar137);
            auVar141 = vandps_avx(ZEXT1632(auVar16),auVar182);
            auVar141 = vmaxps_avx(auVar137,auVar141);
            auVar141 = vcmpps_avx(auVar141,local_360,1);
            auVar146 = vblendvps_avx(ZEXT1632(auVar13),local_640,auVar141);
            auVar101 = vblendvps_avx(ZEXT1632(auVar15),local_300,auVar141);
            auVar141 = vandps_avx(ZEXT1632(auVar90),auVar182);
            auVar137 = vandps_avx(ZEXT1632(auVar89),auVar182);
            auVar137 = vmaxps_avx(auVar141,auVar137);
            auVar141 = vandps_avx(auVar182,ZEXT1632(auVar128));
            auVar141 = vmaxps_avx(auVar137,auVar141);
            auVar137 = vcmpps_avx(auVar141,local_360,1);
            auVar141 = vblendvps_avx(ZEXT1632(auVar90),local_640,auVar137);
            auVar137 = vblendvps_avx(ZEXT1632(auVar89),local_300,auVar137);
            auVar12 = vfmadd213ps_fma(local_740,local_5a0,ZEXT1632(auVar12));
            auVar13 = vfmadd213ps_fma(auVar146,auVar146,ZEXT832(0) << 0x20);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar101,auVar101);
            auVar123 = vrsqrtps_avx(ZEXT1632(auVar13));
            fVar127 = auVar123._0_4_;
            fVar103 = auVar123._4_4_;
            fVar105 = auVar123._8_4_;
            fVar106 = auVar123._12_4_;
            fVar107 = auVar123._16_4_;
            fVar108 = auVar123._20_4_;
            fVar109 = auVar123._24_4_;
            auVar48._4_4_ = fVar103 * fVar103 * fVar103 * auVar13._4_4_ * -0.5;
            auVar48._0_4_ = fVar127 * fVar127 * fVar127 * auVar13._0_4_ * -0.5;
            auVar48._8_4_ = fVar105 * fVar105 * fVar105 * auVar13._8_4_ * -0.5;
            auVar48._12_4_ = fVar106 * fVar106 * fVar106 * auVar13._12_4_ * -0.5;
            auVar48._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
            auVar48._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
            auVar48._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar48._28_4_ = 0;
            auVar203._8_4_ = 0x3fc00000;
            auVar203._0_8_ = 0x3fc000003fc00000;
            auVar203._12_4_ = 0x3fc00000;
            auVar203._16_4_ = 0x3fc00000;
            auVar203._20_4_ = 0x3fc00000;
            auVar203._24_4_ = 0x3fc00000;
            auVar203._28_4_ = 0x3fc00000;
            auVar13 = vfmadd231ps_fma(auVar48,auVar203,auVar123);
            fVar127 = auVar13._0_4_;
            fVar103 = auVar13._4_4_;
            auVar49._4_4_ = auVar101._4_4_ * fVar103;
            auVar49._0_4_ = auVar101._0_4_ * fVar127;
            fVar105 = auVar13._8_4_;
            auVar49._8_4_ = auVar101._8_4_ * fVar105;
            fVar106 = auVar13._12_4_;
            auVar49._12_4_ = auVar101._12_4_ * fVar106;
            auVar49._16_4_ = auVar101._16_4_ * 0.0;
            auVar49._20_4_ = auVar101._20_4_ * 0.0;
            auVar49._24_4_ = auVar101._24_4_ * 0.0;
            auVar49._28_4_ = auVar123._28_4_;
            auVar50._4_4_ = fVar103 * -auVar146._4_4_;
            auVar50._0_4_ = fVar127 * -auVar146._0_4_;
            auVar50._8_4_ = fVar105 * -auVar146._8_4_;
            auVar50._12_4_ = fVar106 * -auVar146._12_4_;
            auVar50._16_4_ = -auVar146._16_4_ * 0.0;
            auVar50._20_4_ = -auVar146._20_4_ * 0.0;
            auVar50._24_4_ = -auVar146._24_4_ * 0.0;
            auVar50._28_4_ = auVar101._28_4_;
            auVar13 = vfmadd213ps_fma(auVar141,auVar141,ZEXT832(0) << 0x20);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar137,auVar137);
            auVar146 = vrsqrtps_avx(ZEXT1632(auVar13));
            auVar51._28_4_ = local_700._28_4_;
            auVar51._0_28_ =
                 ZEXT1628(CONCAT412(fVar106 * 0.0,
                                    CONCAT48(fVar105 * 0.0,CONCAT44(fVar103 * 0.0,fVar127 * 0.0))));
            fVar127 = auVar146._0_4_;
            fVar103 = auVar146._4_4_;
            fVar105 = auVar146._8_4_;
            fVar106 = auVar146._12_4_;
            fVar107 = auVar146._16_4_;
            fVar108 = auVar146._20_4_;
            fVar109 = auVar146._24_4_;
            auVar52._4_4_ = fVar103 * fVar103 * fVar103 * auVar13._4_4_ * -0.5;
            auVar52._0_4_ = fVar127 * fVar127 * fVar127 * auVar13._0_4_ * -0.5;
            auVar52._8_4_ = fVar105 * fVar105 * fVar105 * auVar13._8_4_ * -0.5;
            auVar52._12_4_ = fVar106 * fVar106 * fVar106 * auVar13._12_4_ * -0.5;
            auVar52._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
            auVar52._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
            auVar52._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar52._28_4_ = 0;
            auVar13 = vfmadd231ps_fma(auVar52,auVar203,auVar146);
            fVar127 = auVar13._0_4_;
            fVar103 = auVar13._4_4_;
            auVar53._4_4_ = auVar137._4_4_ * fVar103;
            auVar53._0_4_ = auVar137._0_4_ * fVar127;
            fVar105 = auVar13._8_4_;
            auVar53._8_4_ = auVar137._8_4_ * fVar105;
            fVar106 = auVar13._12_4_;
            auVar53._12_4_ = auVar137._12_4_ * fVar106;
            auVar53._16_4_ = auVar137._16_4_ * 0.0;
            auVar53._20_4_ = auVar137._20_4_ * 0.0;
            auVar53._24_4_ = auVar137._24_4_ * 0.0;
            auVar53._28_4_ = 0;
            auVar54._4_4_ = fVar103 * -auVar141._4_4_;
            auVar54._0_4_ = fVar127 * -auVar141._0_4_;
            auVar54._8_4_ = fVar105 * -auVar141._8_4_;
            auVar54._12_4_ = fVar106 * -auVar141._12_4_;
            auVar54._16_4_ = -auVar141._16_4_ * 0.0;
            auVar54._20_4_ = -auVar141._20_4_ * 0.0;
            auVar54._24_4_ = -auVar141._24_4_ * 0.0;
            auVar54._28_4_ = auVar146._28_4_;
            auVar55._28_4_ = 0xbf000000;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar106 * 0.0,
                                    CONCAT48(fVar105 * 0.0,CONCAT44(fVar103 * 0.0,fVar127 * 0.0))));
            auVar13 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar11),local_4e0);
            auVar141 = ZEXT1632(auVar11);
            auVar15 = vfmadd213ps_fma(auVar50,auVar141,auVar94);
            auVar16 = vfmadd213ps_fma(auVar51,auVar141,ZEXT1632(auVar12));
            auVar88 = vfnmadd213ps_fma(auVar49,auVar141,local_4e0);
            auVar90 = vfmadd213ps_fma(auVar53,local_480,local_5c0);
            auVar113 = vfnmadd213ps_fma(auVar50,auVar141,auVar94);
            auVar89 = vfmadd213ps_fma(auVar54,local_480,auVar168);
            auVar119 = ZEXT1632(auVar11);
            auVar12 = vfnmadd231ps_fma(ZEXT1632(auVar12),auVar119,auVar51);
            auVar128 = vfmadd213ps_fma(auVar55,local_480,local_340);
            auVar144 = vfnmadd213ps_fma(auVar53,local_480,local_5c0);
            auVar151 = vfnmadd213ps_fma(auVar54,local_480,auVar168);
            auVar87 = vfnmadd231ps_fma(local_340,local_480,auVar55);
            auVar141 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar113));
            auVar137 = vsubps_avx(ZEXT1632(auVar128),ZEXT1632(auVar12));
            auVar56._4_4_ = auVar141._4_4_ * auVar12._4_4_;
            auVar56._0_4_ = auVar141._0_4_ * auVar12._0_4_;
            auVar56._8_4_ = auVar141._8_4_ * auVar12._8_4_;
            auVar56._12_4_ = auVar141._12_4_ * auVar12._12_4_;
            auVar56._16_4_ = auVar141._16_4_ * 0.0;
            auVar56._20_4_ = auVar141._20_4_ * 0.0;
            auVar56._24_4_ = auVar141._24_4_ * 0.0;
            auVar56._28_4_ = 0;
            auVar112 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar113),auVar137);
            auVar57._4_4_ = auVar88._4_4_ * auVar137._4_4_;
            auVar57._0_4_ = auVar88._0_4_ * auVar137._0_4_;
            auVar57._8_4_ = auVar88._8_4_ * auVar137._8_4_;
            auVar57._12_4_ = auVar88._12_4_ * auVar137._12_4_;
            auVar57._16_4_ = auVar137._16_4_ * 0.0;
            auVar57._20_4_ = auVar137._20_4_ * 0.0;
            auVar57._24_4_ = auVar137._24_4_ * 0.0;
            auVar57._28_4_ = auVar137._28_4_;
            auVar183 = ZEXT1632(auVar88);
            auVar137 = vsubps_avx(ZEXT1632(auVar90),auVar183);
            auVar100 = ZEXT1632(auVar12);
            auVar12 = vfmsub231ps_fma(auVar57,auVar100,auVar137);
            auVar58._4_4_ = auVar113._4_4_ * auVar137._4_4_;
            auVar58._0_4_ = auVar113._0_4_ * auVar137._0_4_;
            auVar58._8_4_ = auVar113._8_4_ * auVar137._8_4_;
            auVar58._12_4_ = auVar113._12_4_ * auVar137._12_4_;
            auVar58._16_4_ = auVar137._16_4_ * 0.0;
            auVar58._20_4_ = auVar137._20_4_ * 0.0;
            auVar58._24_4_ = auVar137._24_4_ * 0.0;
            auVar58._28_4_ = auVar137._28_4_;
            auVar88 = vfmsub231ps_fma(auVar58,auVar183,auVar141);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar88),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar112));
            auVar94 = vcmpps_avx(ZEXT1632(auVar12),ZEXT832(0) << 0x20,2);
            auVar141 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar13),auVar94);
            auVar137 = vblendvps_avx(ZEXT1632(auVar151),ZEXT1632(auVar15),auVar94);
            local_640 = vblendvps_avx(ZEXT1632(auVar87),ZEXT1632(auVar16),auVar94);
            auVar146 = vblendvps_avx(auVar183,ZEXT1632(auVar90),auVar94);
            auVar101 = vblendvps_avx(ZEXT1632(auVar113),ZEXT1632(auVar89),auVar94);
            auVar123 = vblendvps_avx(auVar100,ZEXT1632(auVar128),auVar94);
            auVar183 = vblendvps_avx(ZEXT1632(auVar90),auVar183,auVar94);
            auVar178 = vblendvps_avx(ZEXT1632(auVar89),ZEXT1632(auVar113),auVar94);
            auVar12 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
            local_740 = ZEXT1632(auVar12);
            auVar100 = vblendvps_avx(ZEXT1632(auVar128),auVar100,auVar94);
            auVar183 = vsubps_avx(auVar183,auVar141);
            auVar178 = vsubps_avx(auVar178,auVar137);
            auVar168 = vsubps_avx(auVar100,local_640);
            auVar93 = vsubps_avx(auVar141,auVar146);
            auVar95 = vsubps_avx(auVar137,auVar101);
            auVar118 = vsubps_avx(local_640,auVar123);
            auVar161._0_4_ = auVar168._0_4_ * auVar141._0_4_;
            auVar161._4_4_ = auVar168._4_4_ * auVar141._4_4_;
            auVar161._8_4_ = auVar168._8_4_ * auVar141._8_4_;
            auVar161._12_4_ = auVar168._12_4_ * auVar141._12_4_;
            auVar161._16_4_ = auVar168._16_4_ * auVar141._16_4_;
            auVar161._20_4_ = auVar168._20_4_ * auVar141._20_4_;
            auVar161._24_4_ = auVar168._24_4_ * auVar141._24_4_;
            auVar161._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar161,local_640,auVar183);
            auVar59._4_4_ = auVar183._4_4_ * auVar137._4_4_;
            auVar59._0_4_ = auVar183._0_4_ * auVar137._0_4_;
            auVar59._8_4_ = auVar183._8_4_ * auVar137._8_4_;
            auVar59._12_4_ = auVar183._12_4_ * auVar137._12_4_;
            auVar59._16_4_ = auVar183._16_4_ * auVar137._16_4_;
            auVar59._20_4_ = auVar183._20_4_ * auVar137._20_4_;
            auVar59._24_4_ = auVar183._24_4_ * auVar137._24_4_;
            auVar59._28_4_ = auVar100._28_4_;
            auVar15 = vfmsub231ps_fma(auVar59,auVar141,auVar178);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar162._0_4_ = auVar178._0_4_ * local_640._0_4_;
            auVar162._4_4_ = auVar178._4_4_ * local_640._4_4_;
            auVar162._8_4_ = auVar178._8_4_ * local_640._8_4_;
            auVar162._12_4_ = auVar178._12_4_ * local_640._12_4_;
            auVar162._16_4_ = auVar178._16_4_ * local_640._16_4_;
            auVar162._20_4_ = auVar178._20_4_ * local_640._20_4_;
            auVar162._24_4_ = auVar178._24_4_ * local_640._24_4_;
            auVar162._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar162,auVar137,auVar168);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar143 = ZEXT1664(auVar15);
            auVar163._0_4_ = auVar118._0_4_ * auVar146._0_4_;
            auVar163._4_4_ = auVar118._4_4_ * auVar146._4_4_;
            auVar163._8_4_ = auVar118._8_4_ * auVar146._8_4_;
            auVar163._12_4_ = auVar118._12_4_ * auVar146._12_4_;
            auVar163._16_4_ = auVar118._16_4_ * auVar146._16_4_;
            auVar163._20_4_ = auVar118._20_4_ * auVar146._20_4_;
            auVar163._24_4_ = auVar118._24_4_ * auVar146._24_4_;
            auVar163._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar163,auVar93,auVar123);
            auVar60._4_4_ = auVar95._4_4_ * auVar123._4_4_;
            auVar60._0_4_ = auVar95._0_4_ * auVar123._0_4_;
            auVar60._8_4_ = auVar95._8_4_ * auVar123._8_4_;
            auVar60._12_4_ = auVar95._12_4_ * auVar123._12_4_;
            auVar60._16_4_ = auVar95._16_4_ * auVar123._16_4_;
            auVar60._20_4_ = auVar95._20_4_ * auVar123._20_4_;
            auVar60._24_4_ = auVar95._24_4_ * auVar123._24_4_;
            auVar60._28_4_ = auVar141._28_4_;
            auVar16 = vfmsub231ps_fma(auVar60,auVar101,auVar118);
            auVar61._4_4_ = auVar93._4_4_ * auVar101._4_4_;
            auVar61._0_4_ = auVar93._0_4_ * auVar101._0_4_;
            auVar61._8_4_ = auVar93._8_4_ * auVar101._8_4_;
            auVar61._12_4_ = auVar93._12_4_ * auVar101._12_4_;
            auVar61._16_4_ = auVar93._16_4_ * auVar101._16_4_;
            auVar61._20_4_ = auVar93._20_4_ * auVar101._20_4_;
            auVar61._24_4_ = auVar93._24_4_ * auVar101._24_4_;
            auVar61._28_4_ = auVar101._28_4_;
            auVar90 = vfmsub231ps_fma(auVar61,auVar95,auVar146);
            auVar101 = ZEXT832(0) << 0x20;
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar101,ZEXT1632(auVar13));
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar101,ZEXT1632(auVar16));
            auVar146 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
            auVar146 = vcmpps_avx(auVar146,auVar101,2);
            auVar13 = vpackssdw_avx(auVar146._0_16_,auVar146._16_16_);
            auVar13 = vpand_avx(auVar13,auVar12);
            auVar146 = vpmovsxwd_avx2(auVar13);
            if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar146 >> 0x7f,0) == '\0') &&
                  (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar146 >> 0xbf,0) == '\0') &&
                (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar146[0x1f]) {
LAB_015f1924:
              auVar148._8_8_ = uStack_518;
              auVar148._0_8_ = local_520;
              auVar148._16_8_ = uStack_510;
              auVar148._24_8_ = uStack_508;
              auVar184 = ZEXT3264(auVar179);
              auVar197 = ZEXT3264(auVar193);
            }
            else {
              auVar62._4_4_ = auVar178._4_4_ * auVar118._4_4_;
              auVar62._0_4_ = auVar178._0_4_ * auVar118._0_4_;
              auVar62._8_4_ = auVar178._8_4_ * auVar118._8_4_;
              auVar62._12_4_ = auVar178._12_4_ * auVar118._12_4_;
              auVar62._16_4_ = auVar178._16_4_ * auVar118._16_4_;
              auVar62._20_4_ = auVar178._20_4_ * auVar118._20_4_;
              auVar62._24_4_ = auVar178._24_4_ * auVar118._24_4_;
              auVar62._28_4_ = auVar146._28_4_;
              auVar112 = vfmsub231ps_fma(auVar62,auVar95,auVar168);
              auVar164._0_4_ = auVar168._0_4_ * auVar93._0_4_;
              auVar164._4_4_ = auVar168._4_4_ * auVar93._4_4_;
              auVar164._8_4_ = auVar168._8_4_ * auVar93._8_4_;
              auVar164._12_4_ = auVar168._12_4_ * auVar93._12_4_;
              auVar164._16_4_ = auVar168._16_4_ * auVar93._16_4_;
              auVar164._20_4_ = auVar168._20_4_ * auVar93._20_4_;
              auVar164._24_4_ = auVar168._24_4_ * auVar93._24_4_;
              auVar164._28_4_ = 0;
              auVar128 = vfmsub231ps_fma(auVar164,auVar183,auVar118);
              auVar63._4_4_ = auVar183._4_4_ * auVar95._4_4_;
              auVar63._0_4_ = auVar183._0_4_ * auVar95._0_4_;
              auVar63._8_4_ = auVar183._8_4_ * auVar95._8_4_;
              auVar63._12_4_ = auVar183._12_4_ * auVar95._12_4_;
              auVar63._16_4_ = auVar183._16_4_ * auVar95._16_4_;
              auVar63._20_4_ = auVar183._20_4_ * auVar95._20_4_;
              auVar63._24_4_ = auVar183._24_4_ * auVar95._24_4_;
              auVar63._28_4_ = auVar95._28_4_;
              auVar88 = vfmsub231ps_fma(auVar63,auVar93,auVar178);
              auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar128),ZEXT1632(auVar88));
              auVar89 = vfmadd231ps_fma(ZEXT1632(auVar90),ZEXT1632(auVar112),auVar101);
              auVar146 = vrcpps_avx(ZEXT1632(auVar89));
              auVar195._8_4_ = 0x3f800000;
              auVar195._0_8_ = 0x3f8000003f800000;
              auVar195._12_4_ = 0x3f800000;
              auVar195._16_4_ = 0x3f800000;
              auVar195._20_4_ = 0x3f800000;
              auVar195._24_4_ = 0x3f800000;
              auVar195._28_4_ = 0x3f800000;
              auVar90 = vfnmadd213ps_fma(auVar146,ZEXT1632(auVar89),auVar195);
              auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar146,auVar146);
              auVar64._4_4_ = auVar88._4_4_ * local_640._4_4_;
              auVar64._0_4_ = auVar88._0_4_ * local_640._0_4_;
              auVar64._8_4_ = auVar88._8_4_ * local_640._8_4_;
              auVar64._12_4_ = auVar88._12_4_ * local_640._12_4_;
              auVar64._16_4_ = local_640._16_4_ * 0.0;
              auVar64._20_4_ = local_640._20_4_ * 0.0;
              auVar64._24_4_ = local_640._24_4_ * 0.0;
              auVar64._28_4_ = auVar137._28_4_;
              auVar128 = vfmadd231ps_fma(auVar64,ZEXT1632(auVar128),auVar137);
              auVar128 = vfmadd231ps_fma(ZEXT1632(auVar128),ZEXT1632(auVar112),auVar141);
              fVar127 = auVar90._0_4_;
              fVar103 = auVar90._4_4_;
              fVar105 = auVar90._8_4_;
              fVar106 = auVar90._12_4_;
              auVar146 = ZEXT1632(CONCAT412(fVar106 * auVar128._12_4_,
                                            CONCAT48(fVar105 * auVar128._8_4_,
                                                     CONCAT44(fVar103 * auVar128._4_4_,
                                                              fVar127 * auVar128._0_4_))));
              uVar110 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar147._4_4_ = uVar110;
              auVar147._0_4_ = uVar110;
              auVar147._8_4_ = uVar110;
              auVar147._12_4_ = uVar110;
              auVar147._16_4_ = uVar110;
              auVar147._20_4_ = uVar110;
              auVar147._24_4_ = uVar110;
              auVar147._28_4_ = uVar110;
              auVar75._4_4_ = uStack_fc;
              auVar75._0_4_ = local_100;
              auVar75._8_4_ = uStack_f8;
              auVar75._12_4_ = uStack_f4;
              auVar75._16_4_ = uStack_f0;
              auVar75._20_4_ = uStack_ec;
              auVar75._24_4_ = uStack_e8;
              auVar75._28_4_ = uStack_e4;
              auVar141 = vcmpps_avx(auVar75,auVar146,2);
              auVar137 = vcmpps_avx(auVar146,auVar147,2);
              auVar141 = vandps_avx(auVar137,auVar141);
              auVar90 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
              auVar13 = vpand_avx(auVar13,auVar90);
              auVar141 = vpmovsxwd_avx2(auVar13);
              if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar141 >> 0x7f,0) == '\0') &&
                    (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar141 >> 0xbf,0) == '\0') &&
                  (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar141[0x1f]) goto LAB_015f1924;
              auVar141 = vcmpps_avx(ZEXT1632(auVar89),ZEXT832(0) << 0x20,4);
              auVar90 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
              auVar13 = vpand_avx(auVar13,auVar90);
              auVar141 = vpmovsxwd_avx2(auVar13);
              auVar148._8_8_ = uStack_518;
              auVar148._0_8_ = local_520;
              auVar148._16_8_ = uStack_510;
              auVar148._24_8_ = uStack_508;
              auVar184 = ZEXT3264(auVar179);
              auVar197 = ZEXT3264(auVar193);
              if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar141 >> 0x7f,0) != '\0') ||
                    (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar141 >> 0xbf,0) != '\0') ||
                  (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar141[0x1f] < '\0') {
                auVar101 = ZEXT1632(CONCAT412(fVar106 * auVar15._12_4_,
                                              CONCAT48(fVar105 * auVar15._8_4_,
                                                       CONCAT44(fVar103 * auVar15._4_4_,
                                                                fVar127 * auVar15._0_4_))));
                auVar65._28_4_ = SUB84(uStack_508,4);
                auVar65._0_28_ =
                     ZEXT1628(CONCAT412(fVar106 * auVar16._12_4_,
                                        CONCAT48(fVar105 * auVar16._8_4_,
                                                 CONCAT44(fVar103 * auVar16._4_4_,
                                                          fVar127 * auVar16._0_4_))));
                auVar174._8_4_ = 0x3f800000;
                auVar174._0_8_ = 0x3f8000003f800000;
                auVar174._12_4_ = 0x3f800000;
                auVar174._16_4_ = 0x3f800000;
                auVar174._20_4_ = 0x3f800000;
                auVar174._24_4_ = 0x3f800000;
                auVar174._28_4_ = 0x3f800000;
                auVar137 = vsubps_avx(auVar174,auVar101);
                auVar137 = vblendvps_avx(auVar137,auVar101,auVar94);
                auVar184 = ZEXT3264(auVar137);
                auVar137 = vsubps_avx(auVar174,auVar65);
                local_3a0 = vblendvps_avx(auVar137,auVar65,auVar94);
                auVar143 = ZEXT3264(local_3a0);
                auVar197 = ZEXT3264(auVar146);
                auVar148 = auVar141;
              }
            }
            if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar148 >> 0x7f,0) == '\0') &&
                  (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar148 >> 0xbf,0) == '\0') &&
                (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar148[0x1f]) goto LAB_015f13e4;
            auVar141 = vsubps_avx(local_480,auVar119);
            auVar146 = auVar184._0_32_;
            auVar13 = vfmadd213ps_fma(auVar141,auVar146,auVar119);
            fVar127 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar66._4_4_ = (auVar13._4_4_ + auVar13._4_4_) * fVar127;
            auVar66._0_4_ = (auVar13._0_4_ + auVar13._0_4_) * fVar127;
            auVar66._8_4_ = (auVar13._8_4_ + auVar13._8_4_) * fVar127;
            auVar66._12_4_ = (auVar13._12_4_ + auVar13._12_4_) * fVar127;
            auVar66._16_4_ = fVar127 * 0.0;
            auVar66._20_4_ = fVar127 * 0.0;
            auVar66._24_4_ = fVar127 * 0.0;
            auVar66._28_4_ = fVar127;
            auVar101 = auVar197._0_32_;
            auVar141 = vcmpps_avx(auVar101,auVar66,6);
            auVar137 = auVar148 & auVar141;
            auVar169 = ZEXT3264(CONCAT428(fStack_6c4,
                                          CONCAT424(fStack_6c8,
                                                    CONCAT420(fStack_6cc,
                                                              CONCAT416(fStack_6d0,
                                                                        CONCAT412(fStack_6d4,
                                                                                  CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
            auVar175 = ZEXT3264(local_720);
            if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar137 >> 0x7f,0) == '\0') &&
                  (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar137 >> 0xbf,0) == '\0') &&
                (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar137[0x1f]) {
              auVar126 = ZEXT3264(local_6c0);
            }
            else {
              auVar125._8_4_ = 0xbf800000;
              auVar125._0_8_ = 0xbf800000bf800000;
              auVar125._12_4_ = 0xbf800000;
              auVar125._16_4_ = 0xbf800000;
              auVar125._20_4_ = 0xbf800000;
              auVar125._24_4_ = 0xbf800000;
              auVar125._28_4_ = 0xbf800000;
              auVar142._8_4_ = 0x40000000;
              auVar142._0_8_ = 0x4000000040000000;
              auVar142._12_4_ = 0x40000000;
              auVar142._16_4_ = 0x40000000;
              auVar142._20_4_ = 0x40000000;
              auVar142._24_4_ = 0x40000000;
              auVar142._28_4_ = 0x40000000;
              auVar143 = ZEXT3264(auVar142);
              auVar13 = vfmadd213ps_fma(local_3a0,auVar142,auVar125);
              local_240 = ZEXT1632(auVar13);
              local_1f0 = local_5d0._0_8_;
              uStack_1e8 = local_5d0._8_8_;
              local_1e0 = local_690._0_8_;
              uStack_1d8 = local_690._8_8_;
              local_1d0 = local_6a0;
              pGVar9 = (context->scene->geometries).items[local_748].ptr;
              local_3a0 = local_240;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar77 = 0;
                auVar126 = ZEXT3264(local_6c0);
              }
              else {
                auVar126 = ZEXT3264(local_6c0);
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (bVar77 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar141 = vandps_avx(auVar141,auVar148);
                  fVar127 = (float)local_200;
                  auVar143 = ZEXT3264(CONCAT428(fVar127,CONCAT424(fVar127,CONCAT420(fVar127,
                                                  CONCAT416(fVar127,CONCAT412(fVar127,CONCAT48(
                                                  fVar127,CONCAT44(fVar127,fVar127))))))));
                  local_180[0] = (fVar127 + auVar184._0_4_ + 0.0) * local_120;
                  local_180[1] = (fVar127 + auVar184._4_4_ + 1.0) * fStack_11c;
                  local_180[2] = (fVar127 + auVar184._8_4_ + 2.0) * fStack_118;
                  local_180[3] = (fVar127 + auVar184._12_4_ + 3.0) * fStack_114;
                  fStack_170 = (fVar127 + auVar184._16_4_ + 4.0) * fStack_110;
                  fStack_16c = (fVar127 + auVar184._20_4_ + 5.0) * fStack_10c;
                  fStack_168 = (fVar127 + auVar184._24_4_ + 6.0) * fStack_108;
                  fStack_164 = fVar127 + auVar184._28_4_ + 7.0;
                  local_3a0._0_8_ = auVar13._0_8_;
                  local_3a0._8_8_ = auVar13._8_8_;
                  local_160 = local_3a0._0_8_;
                  uStack_158 = local_3a0._8_8_;
                  uStack_150 = 0;
                  uStack_148 = 0;
                  local_140 = auVar101;
                  uVar83 = vmovmskps_avx(auVar141);
                  if (uVar83 == 0) {
                    bVar77 = 0;
LAB_015f195f:
                    auVar184 = ZEXT3264(auVar146);
                    auVar197 = ZEXT3264(auVar101);
                    auVar126 = ZEXT3264(local_6c0);
                    auVar169 = ZEXT3264(CONCAT428(fStack_6c4,
                                                  CONCAT424(fStack_6c8,
                                                            CONCAT420(fStack_6cc,
                                                                      CONCAT416(fStack_6d0,
                                                                                CONCAT412(fStack_6d4
                                                                                          ,CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
                    auVar175 = ZEXT3264(local_720);
                  }
                  else {
                    uVar80 = (ulong)(uVar83 & 0xff);
                    local_740 = ZEXT1632(CONCAT88(auVar12._8_8_,uVar80));
                    lVar84 = 0;
                    for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
                      lVar84 = lVar84 + 1;
                    }
                    local_860 = ZEXT1632(CONCAT88(auVar11._8_8_,lVar84));
                    local_640._0_16_ = *local_678;
                    local_620 = ZEXT1632(CONCAT124(auVar14._4_12_,
                                                   *(undefined4 *)(ray + k * 4 + 0x80)));
                    _local_2e0 = *pauVar1;
                    local_260 = auVar146;
                    local_220 = auVar101;
                    local_1fc = iVar8;
                    do {
                      local_400 = local_180[local_860._0_8_];
                      local_3f0 = *(undefined4 *)((long)&local_160 + local_860._0_8_ * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_140 + local_860._0_8_ * 4);
                      fVar105 = 1.0 - local_400;
                      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * fVar105)),
                                                ZEXT416((uint)(local_400 * fVar105)),
                                                ZEXT416(0xc0000000));
                      auVar11 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar105)),
                                                ZEXT416((uint)(local_400 * local_400)),
                                                ZEXT416(0x40000000));
                      fVar127 = auVar11._0_4_ * 3.0;
                      fVar103 = local_400 * local_400 * 3.0;
                      auVar159._0_4_ = fVar103 * (float)local_490._0_4_;
                      auVar159._4_4_ = fVar103 * (float)local_490._4_4_;
                      auVar159._8_4_ = fVar103 * fStack_488;
                      auVar159._12_4_ = fVar103 * fStack_484;
                      auVar134._4_4_ = fVar127;
                      auVar134._0_4_ = fVar127;
                      auVar134._8_4_ = fVar127;
                      auVar134._12_4_ = fVar127;
                      auVar11 = vfmadd132ps_fma(auVar134,auVar159,local_6a0);
                      fVar127 = auVar12._0_4_ * 3.0;
                      auVar153._4_4_ = fVar127;
                      auVar153._0_4_ = fVar127;
                      auVar153._8_4_ = fVar127;
                      auVar153._12_4_ = fVar127;
                      auVar11 = vfmadd132ps_fma(auVar153,auVar11,local_690);
                      fVar127 = fVar105 * fVar105 * -3.0;
                      local_670.context = context->user;
                      auVar135._4_4_ = fVar127;
                      auVar135._0_4_ = fVar127;
                      auVar135._8_4_ = fVar127;
                      auVar135._12_4_ = fVar127;
                      auVar11 = vfmadd132ps_fma(auVar135,auVar11,local_5d0);
                      local_430 = auVar11._0_4_;
                      local_420 = vshufps_avx(auVar11,auVar11,0x55);
                      local_410 = vshufps_avx(auVar11,auVar11,0xaa);
                      auVar143 = ZEXT1664(local_410);
                      uStack_3d8 = CONCAT44(uStack_5e4,uStack_5e8);
                      local_3e0 = local_5f0;
                      local_3d0 = _local_5e0;
                      vpcmpeqd_avx2(ZEXT1632(_local_5e0),ZEXT1632(_local_5e0));
                      uStack_3bc = (local_670.context)->instID[0];
                      local_3c0 = uStack_3bc;
                      uStack_3b8 = uStack_3bc;
                      uStack_3b4 = uStack_3bc;
                      uStack_3b0 = (local_670.context)->instPrimID[0];
                      uStack_3ac = uStack_3b0;
                      uStack_3a8 = uStack_3b0;
                      uStack_3a4 = uStack_3b0;
                      local_760 = local_640._0_16_;
                      local_670.valid = (int *)local_760;
                      local_670.geometryUserPtr = pGVar9->userPtr;
                      local_670.hit = (RTCHitN *)&local_430;
                      local_670.N = 4;
                      local_670.ray = (RTCRayN *)ray;
                      uStack_42c = local_430;
                      uStack_428 = local_430;
                      uStack_424 = local_430;
                      fStack_3fc = local_400;
                      fStack_3f8 = local_400;
                      fStack_3f4 = local_400;
                      uStack_3ec = local_3f0;
                      uStack_3e8 = local_3f0;
                      uStack_3e4 = local_3f0;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar143 = ZEXT1664(local_410);
                        (*pGVar9->occlusionFilterN)(&local_670);
                      }
                      if (local_760 == (undefined1  [16])0x0) {
                        auVar11 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar11 = auVar11 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var10)(&local_670);
                        }
                        auVar12 = vpcmpeqd_avx(local_760,_DAT_01f7aa10);
                        auVar11 = auVar12 ^ _DAT_01f7ae20;
                        auVar136._8_4_ = 0xff800000;
                        auVar136._0_8_ = 0xff800000ff800000;
                        auVar136._12_4_ = 0xff800000;
                        auVar143 = ZEXT1664(auVar136);
                        auVar12 = vblendvps_avx(auVar136,*(undefined1 (*) [16])
                                                          (local_670.ray + 0x80),auVar12);
                        *(undefined1 (*) [16])(local_670.ray + 0x80) = auVar12;
                      }
                      auVar116._8_8_ = 0x100000001;
                      auVar116._0_8_ = 0x100000001;
                      if ((auVar116 & auVar11) != (undefined1  [16])0x0) {
                        bVar77 = 1;
                        goto LAB_015f195f;
                      }
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_620._0_4_;
                      uVar82 = local_740._0_8_ ^ 1L << (local_860._0_8_ & 0x3f);
                      bVar77 = 0;
                      local_740._0_8_ = uVar82;
                      lVar84 = 0;
                      for (uVar80 = uVar82; (uVar80 & 1) == 0;
                          uVar80 = uVar80 >> 1 | 0x8000000000000000) {
                        lVar84 = lVar84 + 1;
                      }
                      local_860._0_8_ = lVar84;
                      auVar184 = ZEXT3264(auVar146);
                      auVar197 = ZEXT3264(auVar101);
                      auVar126 = ZEXT3264(local_6c0);
                      auVar169 = ZEXT3264(CONCAT428(fStack_6c4,
                                                    CONCAT424(fStack_6c8,
                                                              CONCAT420(fStack_6cc,
                                                                        CONCAT416(fStack_6d0,
                                                                                  CONCAT412(
                                                  fStack_6d4,
                                                  CONCAT48(fStack_6d8,CONCAT44(fStack_6dc,local_6e0)
                                                          )))))));
                      auVar175 = ZEXT3264(local_720);
                    } while (uVar82 != 0);
                  }
                }
              }
              bVar78 = (bool)(bVar78 | bVar77);
            }
          }
          local_7e0 = auVar184._0_32_;
          local_800 = auVar197._0_32_;
          lVar81 = lVar81 + 8;
          auVar149 = ZEXT3264(local_700);
        } while ((int)lVar81 < iVar8);
      }
      if (bVar78) {
        return bVar78;
      }
      uVar110 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar92._4_4_ = uVar110;
      auVar92._0_4_ = uVar110;
      auVar92._8_4_ = uVar110;
      auVar92._12_4_ = uVar110;
      auVar11 = vcmpps_avx(local_2c0,auVar92,2);
      uVar83 = vmovmskps_avx(auVar11);
      uVar79 = uVar79 & uVar79 + 0xf & uVar83;
    } while (uVar79 != 0);
  }
  return bVar78;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }